

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<4,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ushort uVar4;
  ushort uVar5;
  Geometry *pGVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  RTCRayQueryContext *pRVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  ulong uVar19;
  size_t k;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  byte bVar40;
  byte bVar41;
  uint uVar42;
  int iVar43;
  ulong uVar44;
  long lVar45;
  byte bVar46;
  long lVar47;
  long lVar48;
  float *pfVar49;
  ulong uVar50;
  long lVar51;
  ulong *puVar52;
  byte bVar53;
  long lVar54;
  undefined1 (*pauVar55) [32];
  NodeRef root;
  ulong uVar56;
  undefined4 uVar57;
  bool bVar58;
  ulong uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar63 [16];
  undefined1 auVar88 [32];
  undefined1 auVar90 [16];
  undefined1 auVar89 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [36];
  undefined1 auVar107 [64];
  undefined1 extraout_var [36];
  undefined1 extraout_var_00 [36];
  float fVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  int iVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 in_ZMM2 [64];
  undefined1 auVar123 [36];
  undefined1 auVar116 [64];
  undefined1 auVar124 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  undefined1 auVar141 [32];
  uint uVar142;
  uint uVar143;
  uint uVar144;
  uint uVar145;
  undefined4 uVar146;
  undefined4 uVar147;
  undefined1 in_ZMM12 [64];
  undefined1 auVar148 [64];
  undefined1 in_ZMM13 [64];
  undefined1 auVar149 [64];
  undefined1 auVar151 [36];
  undefined1 auVar150 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar152 [64];
  undefined1 auVar154 [36];
  undefined1 auVar153 [64];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar158 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar159 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 auVar160 [64];
  Precalculations pre;
  vfloat<4> lower_y;
  vfloat<4> upper_y;
  vfloat<4> upper_z;
  vfloat<4> lower_z;
  vfloat<4> lower_x;
  TravRayK<8,_false> tray;
  vfloat<4> upper_x;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2d99;
  long local_2d98;
  uint local_2d90;
  uint local_2d8c;
  ulong *local_2d88;
  long local_2d80;
  RayK<8> *local_2d78;
  ulong local_2d70;
  undefined4 local_2d64;
  RTCFilterFunctionNArguments local_2d60;
  undefined1 local_2d30 [16];
  undefined1 local_2d20 [16];
  BVH *local_2d10;
  undefined1 (*local_2d08) [32];
  undefined1 local_2d00 [32];
  undefined1 local_2ce0 [16];
  undefined1 local_2cd0 [16];
  undefined1 local_2cc0 [32];
  undefined1 local_2ca0 [32];
  undefined1 local_2c80 [32];
  undefined1 local_2c60 [8];
  float fStack_2c58;
  float fStack_2c54;
  float fStack_2c50;
  float fStack_2c4c;
  float fStack_2c48;
  float fStack_2c44;
  Intersectors *local_2c28;
  long local_2c20;
  long local_2c18;
  long local_2c10;
  ulong local_2c08;
  undefined1 local_2c00 [32];
  undefined1 local_2be0 [32];
  undefined1 local_2bc0 [32];
  undefined1 local_2ba0 [32];
  int local_2b80;
  int iStack_2b7c;
  int iStack_2b78;
  int iStack_2b74;
  int iStack_2b70;
  int iStack_2b6c;
  int iStack_2b68;
  int iStack_2b64;
  undefined1 local_2b60 [32];
  undefined1 local_2b40 [32];
  undefined1 local_2b20 [32];
  undefined1 local_2b00 [32];
  RTCHitN local_2ae0 [16];
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  uint local_2a00;
  uint uStack_29fc;
  uint uStack_29f8;
  uint uStack_29f4;
  uint uStack_29f0;
  uint uStack_29ec;
  uint uStack_29e8;
  uint uStack_29e4;
  uint local_29e0;
  uint uStack_29dc;
  uint uStack_29d8;
  uint uStack_29d4;
  uint uStack_29d0;
  uint uStack_29cc;
  uint uStack_29c8;
  uint uStack_29c4;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_29c0;
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  float local_28a0;
  float fStack_289c;
  float fStack_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float fStack_2888;
  undefined4 uStack_2884;
  float local_2880;
  float fStack_287c;
  float fStack_2878;
  float fStack_2874;
  float fStack_2870;
  float fStack_286c;
  float fStack_2868;
  undefined4 uStack_2864;
  undefined1 local_2860 [32];
  int local_2840;
  int iStack_283c;
  int iStack_2838;
  int iStack_2834;
  int iStack_2830;
  int iStack_282c;
  int iStack_2828;
  int iStack_2824;
  uint local_2820;
  uint uStack_281c;
  uint uStack_2818;
  uint uStack_2814;
  uint uStack_2810;
  uint uStack_280c;
  uint uStack_2808;
  uint uStack_2804;
  uint local_2800;
  uint uStack_27fc;
  uint uStack_27f8;
  uint uStack_27f4;
  uint uStack_27f0;
  uint uStack_27ec;
  uint uStack_27e8;
  uint uStack_27e4;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [16];
  undefined8 local_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 local_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 local_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 local_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 local_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 local_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 local_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 local_26b0;
  undefined8 uStack_26a8;
  float local_26a0;
  float fStack_269c;
  float fStack_2698;
  float fStack_2694;
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  float fStack_2684;
  float local_2680;
  float fStack_267c;
  float fStack_2678;
  float fStack_2674;
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  float fStack_2664;
  float local_2660;
  float fStack_265c;
  float fStack_2658;
  float fStack_2654;
  float fStack_2650;
  float fStack_264c;
  float fStack_2648;
  float fStack_2644;
  float local_2640;
  float fStack_263c;
  float fStack_2638;
  float fStack_2634;
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  float fStack_2624;
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar78 [32];
  undefined1 auVar80 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar125 [32];
  
  local_2d10 = (BVH *)This->ptr;
  if ((local_2d10->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar66 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar60 = ZEXT816(0) << 0x40;
      uVar59 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar60),5);
      uVar56 = vpcmpeqd_avx512vl(auVar66,(undefined1  [32])valid_i->field_0);
      uVar59 = uVar59 & uVar56;
      bVar41 = (byte)uVar59;
      if (bVar41 != 0) {
        local_29c0._0_4_ = *(float *)ray;
        local_29c0._4_4_ = *(float *)(ray + 4);
        local_29c0._8_4_ = *(float *)(ray + 8);
        local_29c0._12_4_ = *(float *)(ray + 0xc);
        local_29c0._16_4_ = *(float *)(ray + 0x10);
        local_29c0._20_4_ = *(float *)(ray + 0x14);
        local_29c0._24_4_ = *(float *)(ray + 0x18);
        local_29c0._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_29c0._32_4_ = *(float *)(ray + 0x20);
        local_29c0._36_4_ = *(float *)(ray + 0x24);
        local_29c0._40_4_ = *(float *)(ray + 0x28);
        local_29c0._44_4_ = *(float *)(ray + 0x2c);
        local_29c0._48_4_ = *(float *)(ray + 0x30);
        local_29c0._52_4_ = *(float *)(ray + 0x34);
        local_29c0._56_4_ = *(float *)(ray + 0x38);
        local_29c0._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_29c0._64_4_ = *(float *)(ray + 0x40);
        local_29c0._68_4_ = *(float *)(ray + 0x44);
        local_29c0._72_4_ = *(float *)(ray + 0x48);
        local_29c0._76_4_ = *(float *)(ray + 0x4c);
        local_29c0._80_4_ = *(float *)(ray + 0x50);
        local_29c0._84_4_ = *(float *)(ray + 0x54);
        local_29c0._88_4_ = *(float *)(ray + 0x58);
        local_29c0._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_2960 = *(undefined1 (*) [32])(ray + 0x80);
        local_2940 = *(undefined1 (*) [32])(ray + 0xa0);
        local_2920 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar82._8_4_ = 0x7fffffff;
        auVar82._0_8_ = 0x7fffffff7fffffff;
        auVar82._12_4_ = 0x7fffffff;
        auVar82._16_4_ = 0x7fffffff;
        auVar82._20_4_ = 0x7fffffff;
        auVar82._24_4_ = 0x7fffffff;
        auVar82._28_4_ = 0x7fffffff;
        auVar66 = vandps_avx(auVar82,local_2960);
        auVar64._8_4_ = 0x219392ef;
        auVar64._0_8_ = 0x219392ef219392ef;
        auVar64._12_4_ = 0x219392ef;
        auVar64._16_4_ = 0x219392ef;
        auVar64._20_4_ = 0x219392ef;
        auVar64._24_4_ = 0x219392ef;
        auVar64._28_4_ = 0x219392ef;
        uVar56 = vcmpps_avx512vl(auVar66,auVar64,1);
        bVar58 = (bool)((byte)uVar56 & 1);
        auVar65._0_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2960._0_4_;
        bVar58 = (bool)((byte)(uVar56 >> 1) & 1);
        auVar65._4_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2960._4_4_;
        bVar58 = (bool)((byte)(uVar56 >> 2) & 1);
        auVar65._8_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2960._8_4_;
        bVar58 = (bool)((byte)(uVar56 >> 3) & 1);
        auVar65._12_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2960._12_4_;
        bVar58 = (bool)((byte)(uVar56 >> 4) & 1);
        auVar65._16_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2960._16_4_;
        bVar58 = (bool)((byte)(uVar56 >> 5) & 1);
        auVar65._20_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2960._20_4_;
        bVar58 = (bool)((byte)(uVar56 >> 6) & 1);
        auVar65._24_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2960._24_4_;
        bVar58 = SUB81(uVar56 >> 7,0);
        auVar65._28_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2960._28_4_;
        auVar66 = vandps_avx(auVar82,local_2940);
        uVar56 = vcmpps_avx512vl(auVar66,auVar64,1);
        bVar58 = (bool)((byte)uVar56 & 1);
        auVar67._0_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2940._0_4_;
        bVar58 = (bool)((byte)(uVar56 >> 1) & 1);
        auVar67._4_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2940._4_4_;
        bVar58 = (bool)((byte)(uVar56 >> 2) & 1);
        auVar67._8_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2940._8_4_;
        bVar58 = (bool)((byte)(uVar56 >> 3) & 1);
        auVar67._12_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2940._12_4_;
        bVar58 = (bool)((byte)(uVar56 >> 4) & 1);
        auVar67._16_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2940._16_4_;
        bVar58 = (bool)((byte)(uVar56 >> 5) & 1);
        auVar67._20_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2940._20_4_;
        bVar58 = (bool)((byte)(uVar56 >> 6) & 1);
        auVar67._24_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2940._24_4_;
        bVar58 = SUB81(uVar56 >> 7,0);
        auVar67._28_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2940._28_4_;
        auVar66 = vandps_avx(auVar82,local_2920);
        uVar56 = vcmpps_avx512vl(auVar66,auVar64,1);
        bVar58 = (bool)((byte)uVar56 & 1);
        auVar66._0_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2920._0_4_;
        bVar58 = (bool)((byte)(uVar56 >> 1) & 1);
        auVar66._4_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2920._4_4_;
        bVar58 = (bool)((byte)(uVar56 >> 2) & 1);
        auVar66._8_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2920._8_4_;
        bVar58 = (bool)((byte)(uVar56 >> 3) & 1);
        auVar66._12_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2920._12_4_;
        bVar58 = (bool)((byte)(uVar56 >> 4) & 1);
        auVar66._16_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2920._16_4_;
        bVar58 = (bool)((byte)(uVar56 >> 5) & 1);
        auVar66._20_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2920._20_4_;
        bVar58 = (bool)((byte)(uVar56 >> 6) & 1);
        auVar66._24_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2920._24_4_;
        bVar58 = SUB81(uVar56 >> 7,0);
        auVar66._28_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * local_2920._28_4_;
        auVar68._8_4_ = 0x3f800000;
        auVar68._0_8_ = &DAT_3f8000003f800000;
        auVar68._12_4_ = 0x3f800000;
        auVar68._16_4_ = 0x3f800000;
        auVar68._20_4_ = 0x3f800000;
        auVar68._24_4_ = 0x3f800000;
        auVar68._28_4_ = 0x3f800000;
        auVar64 = vrcp14ps_avx512vl(auVar65);
        auVar63 = vfnmadd213ps_fma(auVar65,auVar64,auVar68);
        auVar63 = vfmadd132ps_fma(ZEXT1632(auVar63),auVar64,auVar64);
        auVar65 = vrcp14ps_avx512vl(auVar67);
        auVar62 = vfnmadd213ps_fma(auVar67,auVar65,auVar68);
        auVar62 = vfmadd132ps_fma(ZEXT1632(auVar62),auVar65,auVar65);
        auVar65 = vrcp14ps_avx512vl(auVar66);
        auVar61 = vfnmadd213ps_fma(auVar66,auVar65,auVar68);
        local_2900 = ZEXT1632(auVar63);
        local_28e0 = ZEXT1632(auVar62);
        auVar61 = vfmadd132ps_fma(ZEXT1632(auVar61),auVar65,auVar65);
        local_28c0 = ZEXT1632(auVar61);
        local_2860._4_4_ = *(float *)(ray + 0x44) * auVar61._4_4_;
        local_2860._0_4_ = *(float *)(ray + 0x40) * auVar61._0_4_;
        local_2860._8_4_ = *(float *)(ray + 0x48) * auVar61._8_4_;
        local_2860._12_4_ = *(float *)(ray + 0x4c) * auVar61._12_4_;
        local_2860._16_4_ = *(float *)(ray + 0x50) * 0.0;
        local_2860._20_4_ = *(float *)(ray + 0x54) * 0.0;
        local_2860._24_4_ = *(float *)(ray + 0x58) * 0.0;
        local_2860._28_4_ = *(undefined4 *)(ray + 0x5c);
        local_28a0 = *(float *)ray * auVar63._0_4_;
        fStack_289c = *(float *)(ray + 4) * auVar63._4_4_;
        fStack_2898 = *(float *)(ray + 8) * auVar63._8_4_;
        fStack_2894 = *(float *)(ray + 0xc) * auVar63._12_4_;
        fStack_2890 = *(float *)(ray + 0x10) * 0.0;
        fStack_288c = *(float *)(ray + 0x14) * 0.0;
        fStack_2888 = *(float *)(ray + 0x18) * 0.0;
        uStack_2884 = *(undefined4 *)(ray + 0x1c);
        local_2880 = *(float *)(ray + 0x20) * auVar62._0_4_;
        fStack_287c = *(float *)(ray + 0x24) * auVar62._4_4_;
        fStack_2878 = *(float *)(ray + 0x28) * auVar62._8_4_;
        fStack_2874 = *(float *)(ray + 0x2c) * auVar62._12_4_;
        fStack_2870 = *(float *)(ray + 0x30) * 0.0;
        fStack_286c = *(float *)(ray + 0x34) * 0.0;
        fStack_2868 = *(float *)(ray + 0x38) * 0.0;
        uStack_2864 = *(undefined4 *)(ray + 0x3c);
        uVar56 = vcmpps_avx512vl(ZEXT1632(auVar63),ZEXT1632(auVar60),1);
        auVar66 = vpbroadcastd_avx512vl(ZEXT416(0x10));
        local_2840 = (uint)((byte)uVar56 & 1) * auVar66._0_4_;
        iStack_283c = (uint)((byte)(uVar56 >> 1) & 1) * auVar66._4_4_;
        iStack_2838 = (uint)((byte)(uVar56 >> 2) & 1) * auVar66._8_4_;
        iStack_2834 = (uint)((byte)(uVar56 >> 3) & 1) * auVar66._12_4_;
        iStack_2830 = (uint)((byte)(uVar56 >> 4) & 1) * auVar66._16_4_;
        iStack_282c = (uint)((byte)(uVar56 >> 5) & 1) * auVar66._20_4_;
        iStack_2828 = (uint)((byte)(uVar56 >> 6) & 1) * auVar66._24_4_;
        iStack_2824 = (uint)(byte)(uVar56 >> 7) * auVar66._28_4_;
        auVar65 = ZEXT1632(auVar60);
        uVar56 = vcmpps_avx512vl(ZEXT1632(auVar62),auVar65,5);
        auVar66 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        bVar58 = (bool)((byte)uVar56 & 1);
        bVar10 = (bool)((byte)(uVar56 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar56 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar56 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar56 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar56 >> 6) & 1);
        bVar16 = SUB81(uVar56 >> 7,0);
        local_2820 = (uint)bVar58 * auVar66._0_4_ | (uint)!bVar58 * 0x30;
        uStack_281c = (uint)bVar10 * auVar66._4_4_ | (uint)!bVar10 * 0x30;
        uStack_2818 = (uint)bVar11 * auVar66._8_4_ | (uint)!bVar11 * 0x30;
        uStack_2814 = (uint)bVar12 * auVar66._12_4_ | (uint)!bVar12 * 0x30;
        uStack_2810 = (uint)bVar13 * auVar66._16_4_ | (uint)!bVar13 * 0x30;
        uStack_280c = (uint)bVar14 * auVar66._20_4_ | (uint)!bVar14 * 0x30;
        uStack_2808 = (uint)bVar15 * auVar66._24_4_ | (uint)!bVar15 * 0x30;
        uStack_2804 = (uint)bVar16 * auVar66._28_4_ | (uint)!bVar16 * 0x30;
        uVar56 = vcmpps_avx512vl(ZEXT1632(auVar61),auVar65,5);
        auVar66 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar58 = (bool)((byte)uVar56 & 1);
        bVar10 = (bool)((byte)(uVar56 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar56 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar56 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar56 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar56 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar56 >> 6) & 1);
        bVar16 = SUB81(uVar56 >> 7,0);
        local_2800 = (uint)bVar58 * auVar66._0_4_ | (uint)!bVar58 * 0x50;
        uStack_27fc = (uint)bVar10 * auVar66._4_4_ | (uint)!bVar10 * 0x50;
        uStack_27f8 = (uint)bVar11 * auVar66._8_4_ | (uint)!bVar11 * 0x50;
        uStack_27f4 = (uint)bVar12 * auVar66._12_4_ | (uint)!bVar12 * 0x50;
        uStack_27f0 = (uint)bVar13 * auVar66._16_4_ | (uint)!bVar13 * 0x50;
        uStack_27ec = (uint)bVar14 * auVar66._20_4_ | (uint)!bVar14 * 0x50;
        uStack_27e8 = (uint)bVar15 * auVar66._24_4_ | (uint)!bVar15 * 0x50;
        uStack_27e4 = (uint)bVar16 * auVar66._28_4_ | (uint)!bVar16 * 0x50;
        local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar156 = ZEXT3264(local_1e80);
        auVar66 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar65);
        local_27e0._0_4_ =
             (uint)(bVar41 & 1) * auVar66._0_4_ | (uint)!(bool)(bVar41 & 1) * local_1e80._0_4_;
        bVar58 = (bool)((byte)(uVar59 >> 1) & 1);
        local_27e0._4_4_ = (uint)bVar58 * auVar66._4_4_ | (uint)!bVar58 * local_1e80._4_4_;
        bVar58 = (bool)((byte)(uVar59 >> 2) & 1);
        local_27e0._8_4_ = (uint)bVar58 * auVar66._8_4_ | (uint)!bVar58 * local_1e80._8_4_;
        bVar58 = (bool)((byte)(uVar59 >> 3) & 1);
        local_27e0._12_4_ = (uint)bVar58 * auVar66._12_4_ | (uint)!bVar58 * local_1e80._12_4_;
        bVar58 = (bool)((byte)(uVar59 >> 4) & 1);
        local_27e0._16_4_ = (uint)bVar58 * auVar66._16_4_ | (uint)!bVar58 * local_1e80._16_4_;
        bVar58 = (bool)((byte)(uVar59 >> 5) & 1);
        local_27e0._20_4_ = (uint)bVar58 * auVar66._20_4_ | (uint)!bVar58 * local_1e80._20_4_;
        bVar58 = (bool)((byte)(uVar59 >> 6) & 1);
        local_27e0._24_4_ = (uint)bVar58 * auVar66._24_4_ | (uint)!bVar58 * local_1e80._24_4_;
        bVar58 = SUB81(uVar59 >> 7,0);
        local_27e0._28_4_ = (uint)bVar58 * auVar66._28_4_ | (uint)!bVar58 * local_1e80._28_4_;
        local_2d64 = (undefined4)uVar59;
        auVar66 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar65);
        bVar58 = (bool)((byte)(uVar59 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar59 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar59 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar59 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar59 >> 6) & 1);
        bVar15 = SUB81(uVar59 >> 7,0);
        local_27c0._4_4_ = (uint)bVar58 * auVar66._4_4_ | (uint)!bVar58 * -0x800000;
        local_27c0._0_4_ =
             (uint)(bVar41 & 1) * auVar66._0_4_ | (uint)!(bool)(bVar41 & 1) * -0x800000;
        local_27c0._8_4_ = (uint)bVar10 * auVar66._8_4_ | (uint)!bVar10 * -0x800000;
        local_27c0._12_4_ = (uint)bVar11 * auVar66._12_4_ | (uint)!bVar11 * -0x800000;
        local_27c0._16_4_ = (uint)bVar12 * auVar66._16_4_ | (uint)!bVar12 * -0x800000;
        local_27c0._20_4_ = (uint)bVar13 * auVar66._20_4_ | (uint)!bVar13 * -0x800000;
        local_27c0._24_4_ = (uint)bVar14 * auVar66._24_4_ | (uint)!bVar14 * -0x800000;
        local_27c0._28_4_ = (uint)bVar15 * auVar66._28_4_ | (uint)!bVar15 * -0x800000;
        bVar41 = ~bVar41;
        local_2c28 = This;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar59 = 5;
        }
        else {
          uVar59 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2d78 = ray + 0x100;
        puVar52 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar55 = (undefined1 (*) [32])local_1e40;
        local_2608 = (local_2d10->root).ptr;
        local_1e60 = local_27e0;
        local_2d08 = (undefined1 (*) [32])&local_2a00;
        auVar66 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar157 = ZEXT3264(auVar66);
        auVar60 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
        auVar158 = ZEXT1664(auVar60);
        auVar60 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
        auVar159 = ZEXT1664(auVar60);
        local_2d70 = uVar59;
        do {
          pauVar55 = pauVar55 + -1;
          root.ptr = puVar52[-1];
          puVar52 = puVar52 + -1;
          if (root.ptr == 0xfffffffffffffff8) {
LAB_007bdc5d:
            iVar43 = 3;
          }
          else {
            _local_2c60 = *pauVar55;
            uVar56 = vcmpps_avx512vl(_local_2c60,local_27c0,1);
            if ((char)uVar56 == '\0') {
LAB_007bdc6e:
              iVar43 = 2;
            }
            else {
              uVar57 = (undefined4)uVar56;
              iVar43 = 0;
              if ((uint)POPCOUNT(uVar57) <= uVar59) {
                local_2cc0 = in_ZMM25._0_32_;
                local_2ca0 = in_ZMM24._0_32_;
                local_2c80 = in_ZMM23._0_32_;
                local_2d88 = puVar52;
                do {
                  k = 0;
                  for (uVar59 = uVar56; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000
                      ) {
                    k = k + 1;
                  }
                  in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                  in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                  in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                  bVar58 = occluded1(local_2c28,local_2d10,root,k,&local_2d99,ray,
                                     (TravRayK<8,_false> *)&local_29c0.field_0,context);
                  bVar53 = (byte)(1 << ((uint)k & 0x1f));
                  if (!bVar58) {
                    bVar53 = 0;
                  }
                  bVar41 = bVar41 | bVar53;
                  uVar56 = uVar56 - 1 & uVar56;
                } while (uVar56 != 0);
                if (bVar41 == 0xff) {
                  iVar43 = 3;
                }
                else {
                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  local_27c0._0_4_ =
                       (uint)(bVar41 & 1) * auVar66._0_4_ |
                       (uint)!(bool)(bVar41 & 1) * local_27c0._0_4_;
                  bVar58 = (bool)(bVar41 >> 1 & 1);
                  local_27c0._4_4_ = (uint)bVar58 * auVar66._4_4_ | (uint)!bVar58 * local_27c0._4_4_
                  ;
                  bVar58 = (bool)(bVar41 >> 2 & 1);
                  local_27c0._8_4_ = (uint)bVar58 * auVar66._8_4_ | (uint)!bVar58 * local_27c0._8_4_
                  ;
                  bVar58 = (bool)(bVar41 >> 3 & 1);
                  local_27c0._12_4_ =
                       (uint)bVar58 * auVar66._12_4_ | (uint)!bVar58 * local_27c0._12_4_;
                  bVar58 = (bool)(bVar41 >> 4 & 1);
                  local_27c0._16_4_ =
                       (uint)bVar58 * auVar66._16_4_ | (uint)!bVar58 * local_27c0._16_4_;
                  bVar58 = (bool)(bVar41 >> 5 & 1);
                  local_27c0._20_4_ =
                       (uint)bVar58 * auVar66._20_4_ | (uint)!bVar58 * local_27c0._20_4_;
                  bVar58 = (bool)(bVar41 >> 6 & 1);
                  local_27c0._24_4_ =
                       (uint)bVar58 * auVar66._24_4_ | (uint)!bVar58 * local_27c0._24_4_;
                  local_27c0._28_4_ =
                       (uint)(bVar41 >> 7) * auVar66._28_4_ |
                       (uint)!(bool)(bVar41 >> 7) * local_27c0._28_4_;
                  iVar43 = 2;
                }
                auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar156 = ZEXT3264(auVar66);
                auVar66 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar157 = ZEXT3264(auVar66);
                auVar60 = vxorps_avx512vl(auVar158._0_16_,auVar158._0_16_);
                auVar158 = ZEXT1664(auVar60);
                auVar60 = vxorps_avx512vl(auVar159._0_16_,auVar159._0_16_);
                auVar159 = ZEXT1664(auVar60);
                in_ZMM23 = ZEXT3264(local_2c80);
                in_ZMM24 = ZEXT3264(local_2ca0);
                in_ZMM25 = ZEXT3264(local_2cc0);
                uVar59 = local_2d70;
                puVar52 = local_2d88;
              }
              auVar140 = ZEXT3264(_local_2c60);
              if ((uint)uVar59 < (uint)POPCOUNT(uVar57)) {
                do {
                  if ((root.ptr & 8) != 0) {
                    if (root.ptr == 0xfffffffffffffff8) goto LAB_007bdc5d;
                    uVar17 = vcmpps_avx512vl(auVar140._0_32_,local_27c0,9);
                    if ((char)uVar17 != '\0') {
                      local_2c20 = (ulong)((uint)root.ptr & 0xf) - 8;
                      bVar53 = bVar41;
                      if (local_2c20 != 0) {
                        uVar56 = root.ptr & 0xfffffffffffffff0;
                        bVar53 = ~bVar41;
                        lVar47 = 0;
                        local_2d88 = puVar52;
                        do {
                          local_2c18 = lVar47;
                          lVar47 = lVar47 * 0x58;
                          auVar60._8_8_ = 0;
                          auVar60._0_8_ = *(ulong *)(uVar56 + 0x20 + lVar47);
                          auVar63._8_8_ = 0;
                          auVar63._0_8_ = *(ulong *)(uVar56 + 0x24 + lVar47);
                          uVar50 = vpcmpub_avx512vl(auVar60,auVar63,2);
                          if ((uVar50 & 0xf) != 0) {
                            lVar47 = lVar47 + uVar56;
                            uVar50 = (ulong)((byte)uVar50 & 0xf);
                            local_2c10 = lVar47;
                            do {
                              lVar45 = 0;
                              for (uVar44 = uVar50; (uVar44 & 1) == 0;
                                  uVar44 = uVar44 >> 1 | 0x8000000000000000) {
                                lVar45 = lVar45 + 1;
                              }
                              auVar62._8_8_ = 0;
                              auVar62._0_8_ = *(ulong *)(lVar47 + 0x20);
                              auVar60 = vpmovzxbd_avx(auVar62);
                              auVar60 = vcvtdq2ps_avx(auVar60);
                              uVar57 = *(undefined4 *)(lVar47 + 0x44);
                              auVar101._4_4_ = uVar57;
                              auVar101._0_4_ = uVar57;
                              auVar101._8_4_ = uVar57;
                              auVar101._12_4_ = uVar57;
                              uVar57 = *(undefined4 *)(lVar47 + 0x38);
                              auVar110._4_4_ = uVar57;
                              auVar110._0_4_ = uVar57;
                              auVar110._8_4_ = uVar57;
                              auVar110._12_4_ = uVar57;
                              auVar60 = vfmadd213ps_fma(auVar60,auVar101,auVar110);
                              local_2ae0[0] = (RTCHitN)auVar60[0];
                              local_2ae0[1] = (RTCHitN)auVar60[1];
                              local_2ae0[2] = (RTCHitN)auVar60[2];
                              local_2ae0[3] = (RTCHitN)auVar60[3];
                              local_2ae0[4] = (RTCHitN)auVar60[4];
                              local_2ae0[5] = (RTCHitN)auVar60[5];
                              local_2ae0[6] = (RTCHitN)auVar60[6];
                              local_2ae0[7] = (RTCHitN)auVar60[7];
                              local_2ae0[8] = (RTCHitN)auVar60[8];
                              local_2ae0[9] = (RTCHitN)auVar60[9];
                              local_2ae0[10] = (RTCHitN)auVar60[10];
                              local_2ae0[0xb] = (RTCHitN)auVar60[0xb];
                              local_2ae0[0xc] = (RTCHitN)auVar60[0xc];
                              local_2ae0[0xd] = (RTCHitN)auVar60[0xd];
                              local_2ae0[0xe] = (RTCHitN)auVar60[0xe];
                              local_2ae0[0xf] = (RTCHitN)auVar60[0xf];
                              auVar61._8_8_ = 0;
                              auVar61._0_8_ = *(ulong *)(lVar47 + 0x24);
                              auVar60 = vpmovzxbd_avx(auVar61);
                              auVar60 = vcvtdq2ps_avx(auVar60);
                              local_27a0 = vfmadd213ps_fma(auVar60,auVar101,auVar110);
                              auVar91._8_8_ = 0;
                              auVar91._0_8_ = *(ulong *)(lVar47 + 0x28);
                              auVar60 = vpmovzxbd_avx(auVar91);
                              auVar60 = vcvtdq2ps_avx(auVar60);
                              uVar57 = *(undefined4 *)(lVar47 + 0x48);
                              auVar102._4_4_ = uVar57;
                              auVar102._0_4_ = uVar57;
                              auVar102._8_4_ = uVar57;
                              auVar102._12_4_ = uVar57;
                              uVar57 = *(undefined4 *)(lVar47 + 0x3c);
                              auVar111._4_4_ = uVar57;
                              auVar111._0_4_ = uVar57;
                              auVar111._8_4_ = uVar57;
                              auVar111._12_4_ = uVar57;
                              auVar60 = vfmadd213ps_fma(auVar60,auVar102,auVar111);
                              local_2d60.valid = (int *)auVar60._0_8_;
                              local_2d60.geometryUserPtr = (void *)auVar60._8_8_;
                              auVar92._8_8_ = 0;
                              auVar92._0_8_ = *(ulong *)(lVar47 + 0x2c);
                              auVar60 = vpmovzxbd_avx(auVar92);
                              auVar60 = vcvtdq2ps_avx(auVar60);
                              auVar60 = vfmadd213ps_fma(auVar60,auVar102,auVar111);
                              local_2d00._0_16_ = auVar60;
                              auVar90._8_8_ = 0;
                              auVar90._0_8_ = *(ulong *)(lVar47 + 0x30);
                              auVar60 = vpmovzxbd_avx(auVar90);
                              auVar60 = vcvtdq2ps_avx(auVar60);
                              uVar57 = *(undefined4 *)(lVar47 + 0x4c);
                              auVar103._4_4_ = uVar57;
                              auVar103._0_4_ = uVar57;
                              auVar103._8_4_ = uVar57;
                              auVar103._12_4_ = uVar57;
                              uVar57 = *(undefined4 *)(lVar47 + 0x40);
                              auVar112._4_4_ = uVar57;
                              auVar112._0_4_ = uVar57;
                              auVar112._8_4_ = uVar57;
                              auVar112._12_4_ = uVar57;
                              local_2cd0 = vfmadd213ps_fma(auVar60,auVar103,auVar112);
                              auVar93._8_8_ = 0;
                              auVar93._0_8_ = *(ulong *)(lVar47 + 0x34);
                              auVar60 = vpmovzxbd_avx(auVar93);
                              auVar60 = vcvtdq2ps_avx(auVar60);
                              local_2ce0 = vfmadd213ps_fma(auVar60,auVar103,auVar112);
                              auVar69._4_4_ = fStack_289c;
                              auVar69._0_4_ = local_28a0;
                              auVar69._8_4_ = fStack_2898;
                              auVar69._12_4_ = fStack_2894;
                              auVar69._16_4_ = fStack_2890;
                              auVar69._20_4_ = fStack_288c;
                              auVar69._24_4_ = fStack_2888;
                              auVar69._28_4_ = uStack_2884;
                              uVar44 = (ulong)(uint)((int)lVar45 * 4);
                              uVar57 = *(undefined4 *)(local_2ae0 + uVar44);
                              auVar74._4_4_ = uVar57;
                              auVar74._0_4_ = uVar57;
                              auVar74._8_4_ = uVar57;
                              auVar74._12_4_ = uVar57;
                              auVar74._16_4_ = uVar57;
                              auVar74._20_4_ = uVar57;
                              auVar74._24_4_ = uVar57;
                              auVar74._28_4_ = uVar57;
                              auVar60 = vfmsub132ps_fma(auVar74,auVar69,local_2900);
                              auVar73._4_4_ = fStack_287c;
                              auVar73._0_4_ = local_2880;
                              auVar73._8_4_ = fStack_2878;
                              auVar73._12_4_ = fStack_2874;
                              auVar73._16_4_ = fStack_2870;
                              auVar73._20_4_ = fStack_286c;
                              auVar73._24_4_ = fStack_2868;
                              auVar73._28_4_ = uStack_2864;
                              uVar57 = *(undefined4 *)((long)&local_2d60.valid + uVar44);
                              auVar75._4_4_ = uVar57;
                              auVar75._0_4_ = uVar57;
                              auVar75._8_4_ = uVar57;
                              auVar75._12_4_ = uVar57;
                              auVar75._16_4_ = uVar57;
                              auVar75._20_4_ = uVar57;
                              auVar75._24_4_ = uVar57;
                              auVar75._28_4_ = uVar57;
                              uVar57 = *(undefined4 *)(local_2cd0 + uVar44);
                              auVar76._4_4_ = uVar57;
                              auVar76._0_4_ = uVar57;
                              auVar76._8_4_ = uVar57;
                              auVar76._12_4_ = uVar57;
                              auVar76._16_4_ = uVar57;
                              auVar76._20_4_ = uVar57;
                              auVar76._24_4_ = uVar57;
                              auVar76._28_4_ = uVar57;
                              auVar63 = vfmsub132ps_fma(auVar75,auVar73,local_28e0);
                              auVar62 = vfmsub132ps_fma(auVar76,local_2860,local_28c0);
                              uVar57 = *(undefined4 *)(local_27a0 + uVar44);
                              auVar70._4_4_ = uVar57;
                              auVar70._0_4_ = uVar57;
                              auVar70._8_4_ = uVar57;
                              auVar70._12_4_ = uVar57;
                              auVar70._16_4_ = uVar57;
                              auVar70._20_4_ = uVar57;
                              auVar70._24_4_ = uVar57;
                              auVar70._28_4_ = uVar57;
                              auVar67 = vfmsub132ps_avx512vl(local_2900,auVar69,auVar70);
                              uVar57 = *(undefined4 *)(local_2d00 + uVar44);
                              auVar71._4_4_ = uVar57;
                              auVar71._0_4_ = uVar57;
                              auVar71._8_4_ = uVar57;
                              auVar71._12_4_ = uVar57;
                              auVar71._16_4_ = uVar57;
                              auVar71._20_4_ = uVar57;
                              auVar71._24_4_ = uVar57;
                              auVar71._28_4_ = uVar57;
                              auVar64 = vfmsub132ps_avx512vl(local_28e0,auVar73,auVar71);
                              uVar57 = *(undefined4 *)(local_2ce0 + uVar44);
                              auVar72._4_4_ = uVar57;
                              auVar72._0_4_ = uVar57;
                              auVar72._8_4_ = uVar57;
                              auVar72._12_4_ = uVar57;
                              auVar72._16_4_ = uVar57;
                              auVar72._20_4_ = uVar57;
                              auVar72._24_4_ = uVar57;
                              auVar72._28_4_ = uVar57;
                              auVar68 = vfmsub132ps_avx512vl(local_28c0,local_2860,auVar72);
                              auVar66 = vpminsd_avx2(ZEXT1632(auVar60),auVar67);
                              auVar65 = vpminsd_avx2(ZEXT1632(auVar63),auVar64);
                              auVar66 = vpmaxsd_avx2(auVar66,auVar65);
                              auVar65 = vpminsd_avx2(ZEXT1632(auVar62),auVar68);
                              auVar66 = vpmaxsd_avx2(auVar66,auVar65);
                              auVar65 = vpmaxsd_avx2(ZEXT1632(auVar60),auVar67);
                              auVar67 = vpmaxsd_avx2(ZEXT1632(auVar63),auVar64);
                              auVar67 = vpminsd_avx2(auVar65,auVar67);
                              auVar65 = vpmaxsd_avx2(ZEXT1632(auVar62),auVar68);
                              auVar65 = vpminsd_avx2(auVar67,auVar65);
                              auVar66 = vpmaxsd_avx2(auVar66,local_27e0);
                              auVar65 = vpminsd_avx2(auVar65,local_27c0);
                              uVar17 = vpcmpd_avx512vl(auVar66,auVar65,2);
                              if ((bVar53 & (byte)uVar17) == 0) {
                                bVar58 = false;
                              }
                              else {
                                local_2c08 = uVar50;
                                uVar4 = *(ushort *)(lVar47 + lVar45 * 8);
                                uVar5 = *(ushort *)(lVar47 + 2 + lVar45 * 8);
                                pGVar6 = (context->scene->geometries).items
                                         [*(uint *)(lVar47 + 0x50)].ptr;
                                lVar51 = *(long *)&pGVar6->field_0x58;
                                lVar7 = *(long *)&pGVar6[1].time_range.upper;
                                lVar45 = (ulong)*(uint *)(lVar47 + 4 + lVar45 * 8) *
                                         pGVar6[1].super_RefCount.refCounter.
                                         super___atomic_base<unsigned_long>._M_i;
                                local_2d8c = uVar4 & 0x7fff;
                                local_2d90 = uVar5 & 0x7fff;
                                uVar42 = *(uint *)(lVar51 + 4 + lVar45);
                                uVar50 = (ulong)uVar42;
                                uVar44 = (ulong)(uVar42 * local_2d90 +
                                                *(int *)(lVar51 + lVar45) + local_2d8c);
                                p_Var8 = pGVar6[1].intersectionFilterN;
                                puVar1 = (undefined8 *)(lVar7 + (uVar44 + 1) * (long)p_Var8);
                                local_2790 = *puVar1;
                                uStack_2788 = puVar1[1];
                                lVar47 = uVar44 + uVar50;
                                puVar1 = (undefined8 *)(lVar7 + lVar47 * (long)p_Var8);
                                local_2770 = *puVar1;
                                uStack_2768 = puVar1[1];
                                lVar54 = uVar44 + uVar50 + 1;
                                puVar1 = (undefined8 *)(lVar7 + lVar54 * (long)p_Var8);
                                local_2780 = *puVar1;
                                uStack_2778 = puVar1[1];
                                uVar59 = (ulong)(-1 < (short)uVar4);
                                puVar1 = (undefined8 *)
                                         (lVar7 + (uVar44 + uVar59 + 1) * (long)p_Var8);
                                lVar48 = uVar59 + lVar54;
                                puVar2 = (undefined8 *)(lVar7 + lVar48 * (long)p_Var8);
                                local_2740 = *puVar2;
                                uStack_2738 = puVar2[1];
                                if ((short)uVar5 < 0) {
                                  uVar50 = 0;
                                }
                                puVar2 = (undefined8 *)(lVar7 + (lVar47 + uVar50) * (long)p_Var8);
                                puVar3 = (undefined8 *)(lVar7 + (lVar54 + uVar50) * (long)p_Var8);
                                local_2700 = *puVar3;
                                uStack_26f8 = puVar3[1];
                                puVar3 = (undefined8 *)(lVar7 + (uVar50 + lVar48) * (long)p_Var8);
                                auVar60 = vpbroadcastd_avx512vl();
                                auVar140 = ZEXT1664(auVar60);
                                local_27a0 = *(undefined1 (*) [16])(lVar7 + (long)p_Var8 * uVar44);
                                local_2760 = local_2790;
                                uStack_2758 = uStack_2788;
                                local_2750 = *puVar1;
                                uStack_2748 = puVar1[1];
                                local_2730 = local_2780;
                                uStack_2728 = uStack_2778;
                                local_2720 = local_2770;
                                uStack_2718 = uStack_2768;
                                local_2710 = local_2780;
                                uStack_2708 = uStack_2778;
                                local_26f0 = *puVar2;
                                uStack_26e8 = puVar2[1];
                                local_26e0 = local_2780;
                                uStack_26d8 = uStack_2778;
                                local_26d0 = local_2740;
                                uStack_26c8 = uStack_2738;
                                local_26c0 = *puVar3;
                                uStack_26b8 = puVar3[1];
                                local_26b0 = local_2700;
                                uStack_26a8 = uStack_26f8;
                                auVar60 = vpbroadcastd_avx512vl();
                                auVar160 = ZEXT1664(auVar60);
                                pfVar49 = (float *)&uStack_2768;
                                uVar59 = 0;
                                bVar46 = bVar53;
                                do {
                                  fVar118 = pfVar49[-0xe];
                                  auVar124._4_4_ = fVar118;
                                  auVar124._0_4_ = fVar118;
                                  auVar124._8_4_ = fVar118;
                                  auVar124._12_4_ = fVar118;
                                  auVar125._16_4_ = fVar118;
                                  auVar125._0_16_ = auVar124;
                                  auVar125._20_4_ = fVar118;
                                  auVar125._24_4_ = fVar118;
                                  auVar125._28_4_ = fVar118;
                                  fVar119 = pfVar49[-0xd];
                                  auVar131._4_4_ = fVar119;
                                  auVar131._0_4_ = fVar119;
                                  auVar131._8_4_ = fVar119;
                                  auVar131._12_4_ = fVar119;
                                  auVar131._16_4_ = fVar119;
                                  auVar131._20_4_ = fVar119;
                                  auVar131._24_4_ = fVar119;
                                  auVar131._28_4_ = fVar119;
                                  fVar120 = pfVar49[-0xc];
                                  auVar136._4_4_ = fVar120;
                                  auVar136._0_4_ = fVar120;
                                  auVar136._8_4_ = fVar120;
                                  auVar136._12_4_ = fVar120;
                                  auVar136._16_4_ = fVar120;
                                  auVar136._20_4_ = fVar120;
                                  auVar136._24_4_ = fVar120;
                                  auVar136._28_4_ = fVar120;
                                  auVar69 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar49[-10]));
                                  local_2c60._4_4_ = pfVar49[-9];
                                  local_2640 = pfVar49[-8];
                                  auVar70 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar49[-6]));
                                  auVar71 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar49[-5]));
                                  auVar72 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar49[-4]));
                                  local_2660 = pfVar49[-2];
                                  local_2680 = pfVar49[-1];
                                  local_26a0 = *pfVar49;
                                  local_2cd0 = vmovdqa64_avx512vl(auVar160._0_16_);
                                  auVar93 = auVar140._0_16_;
                                  local_2ce0 = vmovdqa64_avx512vl(auVar93);
                                  auVar60 = vsubss_avx512f(auVar124,auVar69._0_16_);
                                  fVar109 = auVar60._0_4_;
                                  auVar129._4_4_ = fVar109;
                                  auVar129._0_4_ = fVar109;
                                  auVar129._8_4_ = fVar109;
                                  auVar129._12_4_ = fVar109;
                                  auVar129._16_4_ = fVar109;
                                  auVar129._20_4_ = fVar109;
                                  auVar129._24_4_ = fVar109;
                                  auVar129._28_4_ = fVar109;
                                  local_2c60._0_4_ = local_2c60._4_4_;
                                  fStack_2c58 = (float)local_2c60._4_4_;
                                  fStack_2c54 = (float)local_2c60._4_4_;
                                  fStack_2c50 = (float)local_2c60._4_4_;
                                  fStack_2c4c = (float)local_2c60._4_4_;
                                  fStack_2c48 = (float)local_2c60._4_4_;
                                  fStack_2c44 = (float)local_2c60._4_4_;
                                  fVar121 = fVar119 - (float)local_2c60._4_4_;
                                  auVar138._4_4_ = fVar121;
                                  auVar138._0_4_ = fVar121;
                                  auVar138._8_4_ = fVar121;
                                  auVar138._12_4_ = fVar121;
                                  auVar138._16_4_ = fVar121;
                                  auVar138._20_4_ = fVar121;
                                  auVar138._24_4_ = fVar121;
                                  auVar138._28_4_ = fVar121;
                                  fStack_263c = local_2640;
                                  fStack_2638 = local_2640;
                                  fStack_2634 = local_2640;
                                  fStack_2630 = local_2640;
                                  fStack_262c = local_2640;
                                  fStack_2628 = local_2640;
                                  fStack_2624 = local_2640;
                                  fVar122 = fVar120 - local_2640;
                                  auVar141._4_4_ = fVar122;
                                  auVar141._0_4_ = fVar122;
                                  auVar141._8_4_ = fVar122;
                                  auVar141._12_4_ = fVar122;
                                  auVar141._16_4_ = fVar122;
                                  auVar141._20_4_ = fVar122;
                                  auVar141._24_4_ = fVar122;
                                  auVar141._28_4_ = fVar122;
                                  fStack_265c = local_2660;
                                  fStack_2658 = local_2660;
                                  fStack_2654 = local_2660;
                                  fStack_2650 = local_2660;
                                  fStack_264c = local_2660;
                                  fStack_2648 = local_2660;
                                  fStack_2644 = local_2660;
                                  fVar118 = local_2660 - fVar118;
                                  auVar155._4_4_ = fVar118;
                                  auVar155._0_4_ = fVar118;
                                  auVar155._8_4_ = fVar118;
                                  auVar155._12_4_ = fVar118;
                                  auVar155._16_4_ = fVar118;
                                  auVar155._20_4_ = fVar118;
                                  auVar155._24_4_ = fVar118;
                                  auVar155._28_4_ = fVar118;
                                  fStack_267c = local_2680;
                                  fStack_2678 = local_2680;
                                  fStack_2674 = local_2680;
                                  fStack_2670 = local_2680;
                                  fStack_266c = local_2680;
                                  fStack_2668 = local_2680;
                                  fStack_2664 = local_2680;
                                  auVar73 = vbroadcastss_avx512vl
                                                      (ZEXT416((uint)(local_2680 - fVar119)));
                                  fStack_269c = local_26a0;
                                  fStack_2698 = local_26a0;
                                  fStack_2694 = local_26a0;
                                  fStack_2690 = local_26a0;
                                  fStack_268c = local_26a0;
                                  fStack_2688 = local_26a0;
                                  fStack_2684 = local_26a0;
                                  auVar74 = vbroadcastss_avx512vl
                                                      (ZEXT416((uint)(local_26a0 - fVar120)));
                                  fVar121 = (local_26a0 - fVar120) * fVar121;
                                  auVar94._4_4_ = fVar121;
                                  auVar94._0_4_ = fVar121;
                                  auVar94._8_4_ = fVar121;
                                  auVar94._12_4_ = fVar121;
                                  auVar94._16_4_ = fVar121;
                                  auVar94._20_4_ = fVar121;
                                  auVar94._24_4_ = fVar121;
                                  auVar94._28_4_ = fVar121;
                                  auVar75 = vfmsub231ps_avx512vl(auVar94,auVar73,auVar141);
                                  fVar118 = fVar122 * fVar118;
                                  auVar104._4_4_ = fVar118;
                                  auVar104._0_4_ = fVar118;
                                  auVar104._8_4_ = fVar118;
                                  auVar104._12_4_ = fVar118;
                                  auVar104._16_4_ = fVar118;
                                  auVar104._20_4_ = fVar118;
                                  auVar104._24_4_ = fVar118;
                                  auVar104._28_4_ = fVar118;
                                  auVar76 = vfmsub231ps_avx512vl(auVar104,auVar74,auVar129);
                                  uVar42 = auVar76._28_4_;
                                  auVar108 = ZEXT436(uVar42);
                                  fVar109 = (local_2680 - fVar119) * fVar109;
                                  auVar113._4_4_ = fVar109;
                                  auVar113._0_4_ = fVar109;
                                  auVar113._8_4_ = fVar109;
                                  auVar113._12_4_ = fVar109;
                                  auVar113._16_4_ = fVar109;
                                  auVar113._20_4_ = fVar109;
                                  auVar113._24_4_ = fVar109;
                                  auVar113._28_4_ = fVar109;
                                  auVar62 = vfmsub231ps_fma(auVar113,auVar155,auVar138);
                                  auVar123 = (undefined1  [36])0x0;
                                  auVar64 = vsubps_avx(auVar125,*(undefined1 (*) [32])ray);
                                  auVar68 = vsubps_avx(auVar131,*(undefined1 (*) [32])(ray + 0x20));
                                  auVar82 = vsubps_avx(auVar136,*(undefined1 (*) [32])(ray + 0x40));
                                  auVar66 = *(undefined1 (*) [32])(ray + 0x80);
                                  auVar65 = *(undefined1 (*) [32])(ray + 0xa0);
                                  auVar67 = *(undefined1 (*) [32])(ray + 0xc0);
                                  auVar148._0_4_ = auVar65._0_4_ * auVar82._0_4_;
                                  auVar148._4_4_ = auVar65._4_4_ * auVar82._4_4_;
                                  auVar148._8_4_ = auVar65._8_4_ * auVar82._8_4_;
                                  auVar148._12_4_ = auVar65._12_4_ * auVar82._12_4_;
                                  auVar148._16_4_ = auVar65._16_4_ * auVar82._16_4_;
                                  auVar148._20_4_ = auVar65._20_4_ * auVar82._20_4_;
                                  auVar148._28_36_ = in_ZMM12._28_36_;
                                  auVar148._24_4_ = auVar65._24_4_ * auVar82._24_4_;
                                  auVar61 = vfmsub231ps_fma(auVar148._0_32_,auVar68,auVar67);
                                  auVar149._0_4_ = auVar67._0_4_ * auVar64._0_4_;
                                  auVar149._4_4_ = auVar67._4_4_ * auVar64._4_4_;
                                  auVar149._8_4_ = auVar67._8_4_ * auVar64._8_4_;
                                  auVar149._12_4_ = auVar67._12_4_ * auVar64._12_4_;
                                  auVar149._16_4_ = auVar67._16_4_ * auVar64._16_4_;
                                  auVar149._20_4_ = auVar67._20_4_ * auVar64._20_4_;
                                  auVar149._28_36_ = in_ZMM13._28_36_;
                                  auVar149._24_4_ = auVar67._24_4_ * auVar64._24_4_;
                                  auVar91 = vfmsub231ps_fma(auVar149._0_32_,auVar82,auVar66);
                                  auVar152._0_4_ = auVar66._0_4_ * auVar68._0_4_;
                                  auVar152._4_4_ = auVar66._4_4_ * auVar68._4_4_;
                                  auVar152._8_4_ = auVar66._8_4_ * auVar68._8_4_;
                                  auVar152._12_4_ = auVar66._12_4_ * auVar68._12_4_;
                                  auVar152._16_4_ = auVar66._16_4_ * auVar68._16_4_;
                                  auVar152._20_4_ = auVar66._20_4_ * auVar68._20_4_;
                                  auVar152._28_36_ = in_ZMM14._28_36_;
                                  auVar152._24_4_ = auVar66._24_4_ * auVar68._24_4_;
                                  auVar92 = vfmsub231ps_fma(auVar152._0_32_,auVar64,auVar65);
                                  auVar154 = (undefined1  [36])0x0;
                                  auVar83._4_4_ = auVar62._4_4_ * auVar67._4_4_;
                                  auVar83._0_4_ = auVar62._0_4_ * auVar67._0_4_;
                                  auVar83._8_4_ = auVar62._8_4_ * auVar67._8_4_;
                                  auVar83._12_4_ = auVar62._12_4_ * auVar67._12_4_;
                                  auVar83._16_4_ = auVar67._16_4_ * 0.0;
                                  auVar83._20_4_ = auVar67._20_4_ * 0.0;
                                  auVar83._24_4_ = auVar67._24_4_ * 0.0;
                                  auVar83._28_4_ = auVar67._28_4_;
                                  auVar60 = vfmadd231ps_fma(auVar83,auVar76,auVar65);
                                  auVar60 = vfmadd231ps_fma(ZEXT1632(auVar60),auVar75,auVar66);
                                  vandps_avx512vl(ZEXT1632(auVar60),auVar157._0_32_);
                                  auVar66 = vmulps_avx512vl(auVar74,ZEXT1632(auVar92));
                                  auVar66 = vfmadd231ps_avx512vl(auVar66,ZEXT1632(auVar91),auVar73);
                                  auVar90 = auVar66._16_16_;
                                  auVar63 = vfmadd231ps_fma(auVar66,ZEXT1632(auVar61),auVar155);
                                  uVar142 = auVar76._0_4_;
                                  auVar132._0_4_ = uVar142 ^ auVar63._0_4_;
                                  uVar143 = auVar76._4_4_;
                                  auVar132._4_4_ = uVar143 ^ auVar63._4_4_;
                                  uVar144 = auVar76._8_4_;
                                  auVar132._8_4_ = uVar144 ^ auVar63._8_4_;
                                  uVar145 = auVar76._12_4_;
                                  auVar132._12_4_ = uVar145 ^ auVar63._12_4_;
                                  uVar57 = auVar76._16_4_;
                                  auVar132._16_4_ = uVar57;
                                  uVar146 = auVar76._20_4_;
                                  auVar132._20_4_ = uVar146;
                                  uVar147 = auVar76._24_4_;
                                  auVar132._24_4_ = uVar147;
                                  auVar132._28_4_ = uVar42;
                                  uVar17 = vcmpps_avx512vl(auVar132,auVar158._0_32_,5);
                                  bVar40 = (byte)uVar17 & bVar46;
                                  if (bVar40 == 0) {
LAB_007bd012:
                                    uVar42 = 0;
                                  }
                                  else {
                                    auVar28._4_4_ = fVar122 * auVar92._4_4_;
                                    auVar28._0_4_ = fVar122 * auVar92._0_4_;
                                    auVar28._8_4_ = fVar122 * auVar92._8_4_;
                                    auVar28._12_4_ = fVar122 * auVar92._12_4_;
                                    auVar28._16_4_ = fVar122 * 0.0;
                                    auVar28._20_4_ = fVar122 * 0.0;
                                    auVar28._24_4_ = fVar122 * 0.0;
                                    auVar28._28_4_ = fVar122;
                                    auVar63 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar138,auVar28);
                                    auVar63 = vfmadd213ps_fma(ZEXT1632(auVar61),auVar129,
                                                              ZEXT1632(auVar63));
                                    auVar130._0_4_ = uVar142 ^ auVar63._0_4_;
                                    auVar130._4_4_ = uVar143 ^ auVar63._4_4_;
                                    auVar130._8_4_ = uVar144 ^ auVar63._8_4_;
                                    auVar130._12_4_ = uVar145 ^ auVar63._12_4_;
                                    auVar130._16_4_ = uVar57;
                                    auVar130._20_4_ = uVar146;
                                    auVar130._24_4_ = uVar147;
                                    auVar130._28_4_ = uVar42;
                                    uVar17 = vcmpps_avx512vl(auVar130,auVar158._0_32_,5);
                                    bVar40 = bVar40 & (byte)uVar17;
                                    if (bVar40 == 0) goto LAB_007bd012;
                                    auVar26._8_4_ = 0x7fffffff;
                                    auVar26._0_8_ = 0x7fffffff7fffffff;
                                    auVar26._12_4_ = 0x7fffffff;
                                    auVar26._16_4_ = 0x7fffffff;
                                    auVar26._20_4_ = 0x7fffffff;
                                    auVar26._24_4_ = 0x7fffffff;
                                    auVar26._28_4_ = 0x7fffffff;
                                    vandps_avx512vl(ZEXT1632(auVar60),auVar26);
                                    auVar65 = vsubps_avx(auVar66,auVar132);
                                    uVar17 = vcmpps_avx512vl(auVar65,auVar130,5);
                                    bVar40 = bVar40 & (byte)uVar17;
                                    if (bVar40 == 0) goto LAB_007bd012;
                                    auVar29._4_4_ = auVar82._4_4_ * auVar62._4_4_;
                                    auVar29._0_4_ = auVar82._0_4_ * auVar62._0_4_;
                                    auVar29._8_4_ = auVar82._8_4_ * auVar62._8_4_;
                                    auVar29._12_4_ = auVar82._12_4_ * auVar62._12_4_;
                                    auVar29._16_4_ = auVar82._16_4_ * 0.0;
                                    auVar29._20_4_ = auVar82._20_4_ * 0.0;
                                    auVar29._24_4_ = auVar82._24_4_ * 0.0;
                                    auVar29._28_4_ = auVar82._28_4_;
                                    auVar63 = vfmadd213ps_fma(auVar68,auVar76,auVar29);
                                    auVar63 = vfmadd213ps_fma(auVar64,auVar75,ZEXT1632(auVar63));
                                    auVar135._0_4_ = auVar66._0_4_ * *(float *)(ray + 0x60);
                                    auVar135._4_4_ = auVar66._4_4_ * *(float *)(ray + 100);
                                    auVar135._8_4_ = auVar66._8_4_ * *(float *)(ray + 0x68);
                                    auVar135._12_4_ = auVar66._12_4_ * *(float *)(ray + 0x6c);
                                    auVar135._16_4_ = auVar66._16_4_ * *(float *)(ray + 0x70);
                                    auVar135._20_4_ = auVar66._20_4_ * *(float *)(ray + 0x74);
                                    auVar135._24_4_ = auVar66._24_4_ * *(float *)(ray + 0x78);
                                    auVar135._28_4_ = 0;
                                    auVar126._0_4_ = uVar142 ^ auVar63._0_4_;
                                    auVar126._4_4_ = uVar143 ^ auVar63._4_4_;
                                    auVar126._8_4_ = uVar144 ^ auVar63._8_4_;
                                    auVar126._12_4_ = uVar145 ^ auVar63._12_4_;
                                    auVar126._16_4_ = uVar57;
                                    auVar126._20_4_ = uVar146;
                                    auVar126._24_4_ = uVar147;
                                    auVar126._28_4_ = uVar42;
                                    auVar30._4_4_ = auVar66._4_4_ * *(float *)(ray + 0x104);
                                    auVar30._0_4_ = auVar66._0_4_ * *(float *)(ray + 0x100);
                                    auVar30._8_4_ = auVar66._8_4_ * *(float *)(ray + 0x108);
                                    auVar30._12_4_ = auVar66._12_4_ * *(float *)(ray + 0x10c);
                                    auVar30._16_4_ = auVar66._16_4_ * *(float *)(ray + 0x110);
                                    auVar30._20_4_ = auVar66._20_4_ * *(float *)(ray + 0x114);
                                    auVar30._24_4_ = auVar66._24_4_ * *(float *)(ray + 0x118);
                                    auVar30._28_4_ = auVar82._28_4_;
                                    uVar17 = vcmpps_avx512vl(auVar126,auVar30,2);
                                    uVar18 = vcmpps_avx512vl(auVar135,auVar126,1);
                                    bVar40 = bVar40 & (byte)uVar17 & (byte)uVar18;
                                    if (bVar40 == 0) {
                                      uVar42 = 0;
                                    }
                                    else {
                                      uVar17 = vcmpps_avx512vl(ZEXT1632(auVar60),ZEXT832(0) << 0x20,
                                                               4);
                                      bVar40 = bVar40 & (byte)uVar17;
                                      uVar42 = (uint)bVar40;
                                      if (bVar40 != 0) {
                                        in_ZMM23 = ZEXT3264(auVar132);
                                        in_ZMM24 = ZEXT3264(auVar130);
                                        local_2ba0 = auVar126;
                                        in_ZMM25 = ZEXT3264(auVar66);
                                        local_2bc0 = auVar75;
                                        local_2be0 = auVar76;
                                        local_2c00 = ZEXT1632(auVar62);
                                      }
                                    }
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar156 = ZEXT3264(auVar66);
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar157 = ZEXT3264(auVar66);
                                    auVar90 = auVar66._16_16_;
                                    auVar60 = vxorps_avx512vl(auVar158._0_16_,auVar158._0_16_);
                                    auVar158 = ZEXT1664(auVar60);
                                    auVar60 = vxorps_avx512vl(auVar159._0_16_,auVar159._0_16_);
                                    auVar159 = ZEXT1664(auVar60);
                                  }
                                  auVar151 = (undefined1  [36])0x0;
                                  auVar60 = auVar158._0_16_;
                                  auVar63 = auVar159._0_16_;
                                  bVar40 = (byte)uVar42;
                                  if (bVar40 != 0) {
                                    auVar62 = vcvtsi2ss_avx512f(auVar93,*(ushort *)
                                                                         (lVar51 + 8 + lVar45) - 1);
                                    auVar78._16_16_ = auVar90;
                                    auVar78._0_16_ = auVar63;
                                    auVar77._4_28_ = auVar78._4_28_;
                                    auVar77._0_4_ = auVar62._0_4_;
                                    auVar61 = vrcp14ss_avx512f(auVar63,auVar77._0_16_);
                                    auVar62 = vfnmadd213ss_avx512f
                                                        (auVar62,auVar61,
                                                         SUB6416(ZEXT464(0x40000000),0));
                                    fVar118 = auVar61._0_4_ * auVar62._0_4_;
                                    auVar62 = vcvtsi2ss_avx512f(auVar93,*(ushort *)
                                                                         (lVar51 + 10 + lVar45) - 1)
                                    ;
                                    auVar80._16_16_ = auVar90;
                                    auVar80._0_16_ = auVar63;
                                    auVar79._4_28_ = auVar80._4_28_;
                                    auVar79._0_4_ = auVar62._0_4_;
                                    auVar61 = vrcp14ss_avx512f(auVar63,auVar79._0_16_);
                                    auVar62 = vfnmadd213ss_avx512f
                                                        (auVar62,auVar61,
                                                         SUB6416(ZEXT464(0x40000000),0));
                                    fVar119 = auVar61._0_4_ * auVar62._0_4_;
                                    auVar62 = vcvtsi2ss_avx512f(auVar93,((uint)uVar59 & 1) +
                                                                        local_2d8c);
                                    auVar114._0_4_ = auVar62._0_4_;
                                    auVar114._4_4_ = auVar114._0_4_;
                                    auVar114._8_4_ = auVar114._0_4_;
                                    auVar114._12_4_ = auVar114._0_4_;
                                    auVar114._16_4_ = auVar114._0_4_;
                                    auVar114._20_4_ = auVar114._0_4_;
                                    auVar114._24_4_ = auVar114._0_4_;
                                    auVar114._28_4_ = auVar114._0_4_;
                                    local_2cc0 = in_ZMM25._0_32_;
                                    auVar66 = vmulps_avx512vl(auVar114,local_2cc0);
                                    auVar81 = vaddps_avx512vl(in_ZMM23._0_32_,auVar66);
                                    auVar123 = ZEXT436(auVar81._28_4_);
                                    auVar95._4_4_ = fVar118;
                                    auVar95._0_4_ = fVar118;
                                    auVar95._8_4_ = fVar118;
                                    auVar95._12_4_ = fVar118;
                                    auVar95._16_4_ = fVar118;
                                    auVar95._20_4_ = fVar118;
                                    auVar95._24_4_ = fVar118;
                                    auVar95._28_4_ = fVar118;
                                    auVar66 = vmulps_avx512vl(auVar81,auVar95);
                                    local_2c80._0_4_ =
                                         (uint)(bVar40 & 1) * auVar66._0_4_ |
                                         (uint)!(bool)(bVar40 & 1) * in_ZMM23._0_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 1) & 1);
                                    local_2c80._4_4_ =
                                         (uint)bVar58 * auVar66._4_4_ |
                                         (uint)!bVar58 * in_ZMM23._4_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 2) & 1);
                                    local_2c80._8_4_ =
                                         (uint)bVar58 * auVar66._8_4_ |
                                         (uint)!bVar58 * in_ZMM23._8_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 3) & 1);
                                    local_2c80._12_4_ =
                                         (uint)bVar58 * auVar66._12_4_ |
                                         (uint)!bVar58 * in_ZMM23._12_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 4) & 1);
                                    local_2c80._16_4_ =
                                         (uint)bVar58 * auVar66._16_4_ |
                                         (uint)!bVar58 * in_ZMM23._16_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 5) & 1);
                                    local_2c80._20_4_ =
                                         (uint)bVar58 * auVar66._20_4_ |
                                         (uint)!bVar58 * in_ZMM23._20_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 6) & 1);
                                    local_2c80._24_4_ =
                                         (uint)bVar58 * auVar66._24_4_ |
                                         (uint)!bVar58 * in_ZMM23._24_4_;
                                    local_2c80._28_4_ =
                                         (uVar42 >> 7) * auVar66._28_4_ |
                                         (uint)!SUB41(uVar42 >> 7,0) * in_ZMM23._28_4_;
                                    in_ZMM23 = ZEXT3264(local_2c80);
                                    auVar62 = vcvtsi2ss_avx512f(auVar93,((uint)(uVar59 >> 1) &
                                                                        0x7fffffff) + local_2d90);
                                    auVar96._0_4_ = auVar62._0_4_;
                                    auVar96._4_4_ = auVar96._0_4_;
                                    auVar96._8_4_ = auVar96._0_4_;
                                    auVar96._12_4_ = auVar96._0_4_;
                                    auVar96._16_4_ = auVar96._0_4_;
                                    auVar96._20_4_ = auVar96._0_4_;
                                    auVar96._24_4_ = auVar96._0_4_;
                                    auVar96._28_4_ = auVar96._0_4_;
                                    auVar66 = vmulps_avx512vl(auVar96,local_2cc0);
                                    auVar66 = vaddps_avx512vl(in_ZMM24._0_32_,auVar66);
                                    auVar105._4_4_ = fVar119;
                                    auVar105._0_4_ = fVar119;
                                    auVar105._8_4_ = fVar119;
                                    auVar105._12_4_ = fVar119;
                                    auVar105._16_4_ = fVar119;
                                    auVar105._20_4_ = fVar119;
                                    auVar105._24_4_ = fVar119;
                                    auVar105._28_4_ = fVar119;
                                    auVar108 = ZEXT436((uint)fVar119);
                                    auVar66 = vmulps_avx512vl(auVar66,auVar105);
                                    local_2ca0._0_4_ =
                                         (uint)(bVar40 & 1) * auVar66._0_4_ |
                                         (uint)!(bool)(bVar40 & 1) * in_ZMM24._0_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 1) & 1);
                                    local_2ca0._4_4_ =
                                         (uint)bVar58 * auVar66._4_4_ |
                                         (uint)!bVar58 * in_ZMM24._4_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 2) & 1);
                                    local_2ca0._8_4_ =
                                         (uint)bVar58 * auVar66._8_4_ |
                                         (uint)!bVar58 * in_ZMM24._8_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 3) & 1);
                                    local_2ca0._12_4_ =
                                         (uint)bVar58 * auVar66._12_4_ |
                                         (uint)!bVar58 * in_ZMM24._12_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 4) & 1);
                                    local_2ca0._16_4_ =
                                         (uint)bVar58 * auVar66._16_4_ |
                                         (uint)!bVar58 * in_ZMM24._16_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 5) & 1);
                                    local_2ca0._20_4_ =
                                         (uint)bVar58 * auVar66._20_4_ |
                                         (uint)!bVar58 * in_ZMM24._20_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 6) & 1);
                                    local_2ca0._24_4_ =
                                         (uint)bVar58 * auVar66._24_4_ |
                                         (uint)!bVar58 * in_ZMM24._24_4_;
                                    local_2ca0._28_4_ =
                                         (uVar42 >> 7) * auVar66._28_4_ |
                                         (uint)!SUB41(uVar42 >> 7,0) * in_ZMM24._28_4_;
                                    in_ZMM24 = ZEXT3264(local_2ca0);
                                    pGVar6 = (context->scene->geometries).items
                                             [*(uint *)(local_2cd0 + uVar59 * 4)].ptr;
                                    uVar42 = pGVar6->mask;
                                    auVar97._4_4_ = uVar42;
                                    auVar97._0_4_ = uVar42;
                                    auVar97._8_4_ = uVar42;
                                    auVar97._12_4_ = uVar42;
                                    auVar97._16_4_ = uVar42;
                                    auVar97._20_4_ = uVar42;
                                    auVar97._24_4_ = uVar42;
                                    auVar97._28_4_ = uVar42;
                                    uVar17 = vptestmd_avx512vl(auVar97,*(undefined1 (*) [32])
                                                                        (ray + 0x120));
                                    bVar40 = (byte)uVar17 & bVar40;
                                    uVar50 = (ulong)bVar40;
                                    if (bVar40 != 0) {
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (auVar108 = ZEXT436((uint)fVar119),
                                         auVar154 = (undefined1  [36])0x0,
                                         pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                        auVar66 = vrcp14ps_avx512vl(local_2cc0);
                                        auVar25._8_4_ = 0x3f800000;
                                        auVar25._0_8_ = &DAT_3f8000003f800000;
                                        auVar25._12_4_ = 0x3f800000;
                                        auVar25._16_4_ = 0x3f800000;
                                        auVar25._20_4_ = 0x3f800000;
                                        auVar25._24_4_ = 0x3f800000;
                                        auVar25._28_4_ = 0x3f800000;
                                        auVar65 = vfnmadd213ps_avx512vl(auVar66,local_2cc0,auVar25);
                                        auVar62 = vfmadd132ps_fma(auVar65,auVar66,auVar66);
                                        auVar108 = (undefined1  [36])0x0;
                                        local_2a80 = vmulps_avx512vl(local_2c80,ZEXT1632(auVar62));
                                        local_2a60 = vmulps_avx512vl(local_2ca0,ZEXT1632(auVar62));
                                        pRVar9 = context->user;
                                        local_2a20 = vpbroadcastd_avx512vl();
                                        local_2a40 = vpbroadcastd_avx512vl();
                                        local_2ae0 = local_2bc0._0_16_;
                                        uStack_2ad0 = local_2bc0._16_8_;
                                        uStack_2ac8 = local_2bc0._24_8_;
                                        local_2ac0 = local_2be0._0_8_;
                                        uStack_2ab8 = local_2be0._8_8_;
                                        uStack_2ab0 = local_2be0._16_8_;
                                        uStack_2aa8 = local_2be0._24_8_;
                                        local_2aa0 = local_2c00._0_8_;
                                        uStack_2a98 = local_2c00._8_8_;
                                        uStack_2a90 = local_2c00._16_8_;
                                        uStack_2a88 = local_2c00._24_8_;
                                        auVar66 = vpcmpeqd_avx2(local_2a80,local_2a80);
                                        local_2d08[1] = auVar66;
                                        *local_2d08 = auVar66;
                                        local_2a00 = pRVar9->instID[0];
                                        uStack_29fc = local_2a00;
                                        uStack_29f8 = local_2a00;
                                        uStack_29f4 = local_2a00;
                                        uStack_29f0 = local_2a00;
                                        uStack_29ec = local_2a00;
                                        uStack_29e8 = local_2a00;
                                        uStack_29e4 = local_2a00;
                                        local_29e0 = pRVar9->instPrimID[0];
                                        uStack_29dc = local_29e0;
                                        uStack_29d8 = local_29e0;
                                        uStack_29d4 = local_29e0;
                                        uStack_29d0 = local_29e0;
                                        uStack_29cc = local_29e0;
                                        uStack_29c8 = local_29e0;
                                        uStack_29c4 = local_29e0;
                                        local_2b80 = *(int *)(ray + 0x100);
                                        iStack_2b7c = *(int *)(ray + 0x104);
                                        iStack_2b78 = *(int *)(ray + 0x108);
                                        iStack_2b74 = *(int *)(ray + 0x10c);
                                        iStack_2b70 = *(int *)(ray + 0x110);
                                        iStack_2b6c = *(int *)(ray + 0x114);
                                        iStack_2b68 = *(int *)(ray + 0x118);
                                        iStack_2b64 = *(int *)(ray + 0x11c);
                                        auVar66 = vmulps_avx512vl(ZEXT1632(auVar62),local_2ba0);
                                        bVar58 = (bool)(bVar40 >> 1 & 1);
                                        bVar10 = (bool)(bVar40 >> 2 & 1);
                                        bVar11 = (bool)(bVar40 >> 3 & 1);
                                        bVar12 = (bool)(bVar40 >> 4 & 1);
                                        bVar13 = (bool)(bVar40 >> 5 & 1);
                                        bVar14 = (bool)(bVar40 >> 6 & 1);
                                        *(uint *)(ray + 0x100) =
                                             (uint)(bVar40 & 1) * auVar66._0_4_ |
                                             (uint)!(bool)(bVar40 & 1) * local_2b80;
                                        *(uint *)(ray + 0x104) =
                                             (uint)bVar58 * auVar66._4_4_ |
                                             (uint)!bVar58 * iStack_2b7c;
                                        *(uint *)(ray + 0x108) =
                                             (uint)bVar10 * auVar66._8_4_ |
                                             (uint)!bVar10 * iStack_2b78;
                                        *(uint *)(ray + 0x10c) =
                                             (uint)bVar11 * auVar66._12_4_ |
                                             (uint)!bVar11 * iStack_2b74;
                                        *(uint *)(ray + 0x110) =
                                             (uint)bVar12 * auVar66._16_4_ |
                                             (uint)!bVar12 * iStack_2b70;
                                        *(uint *)(ray + 0x114) =
                                             (uint)bVar13 * auVar66._20_4_ |
                                             (uint)!bVar13 * iStack_2b6c;
                                        *(uint *)(ray + 0x118) =
                                             (uint)bVar14 * auVar66._24_4_ |
                                             (uint)!bVar14 * iStack_2b68;
                                        *(uint *)(ray + 0x11c) =
                                             (uint)(bVar40 >> 7) * auVar66._28_4_ |
                                             (uint)!(bool)(bVar40 >> 7) * iStack_2b64;
                                        local_2d00 = vpmovm2d_avx512vl((ulong)bVar40);
                                        local_2d60.geometryUserPtr = pGVar6->userPtr;
                                        local_2d60.valid = (int *)local_2d00;
                                        local_2d60.context = context->user;
                                        local_2d60.ray = (RTCRayN *)ray;
                                        local_2d60.hit = local_2ae0;
                                        local_2d60.N = 8;
                                        local_2d20 = vmovdqa64_avx512vl(auVar93);
                                        local_2d30 = vmovdqa64_avx512vl(auVar160._0_16_);
                                        local_2b00 = auVar70;
                                        local_2b20 = auVar71;
                                        local_2b40 = auVar72;
                                        local_2b60 = auVar69;
                                        local_2d98 = lVar51;
                                        auVar154 = (undefined1  [36])0x0;
                                        if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                          auVar151 = (undefined1  [36])0x0;
                                          auVar154 = (undefined1  [36])0x0;
                                          local_2d80 = lVar45;
                                          (*pGVar6->occlusionFilterN)(&local_2d60);
                                          auVar62 = vmovdqa64_avx512vl(local_2d30);
                                          auVar160 = ZEXT1664(auVar62);
                                          auVar62 = vmovdqa64_avx512vl(local_2d20);
                                          auVar140 = ZEXT1664(auVar62);
                                          in_ZMM25 = ZEXT3264(local_2cc0);
                                          in_ZMM24 = ZEXT3264(local_2ca0);
                                          in_ZMM23 = ZEXT3264(local_2c80);
                                          auVar63 = vxorps_avx512vl(auVar63,auVar63);
                                          auVar159 = ZEXT1664(auVar63);
                                          auVar60 = vxorps_avx512vl(auVar60,auVar60);
                                          auVar158 = ZEXT1664(auVar60);
                                          auVar66 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar157 = ZEXT3264(auVar66);
                                          auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar156 = ZEXT3264(auVar66);
                                          lVar45 = local_2d80;
                                          auVar108 = extraout_var;
                                        }
                                        auVar60 = auVar158._0_16_;
                                        auVar63 = auVar159._0_16_;
                                        uVar50 = vptestmd_avx512vl(local_2d00,local_2d00);
                                        if ((char)uVar50 != '\0') {
                                          p_Var8 = context->args->filter;
                                          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                            auVar151 = (undefined1  [36])0x0;
                                            auVar154 = (undefined1  [36])0x0;
                                            (*p_Var8)(&local_2d60);
                                            auVar62 = vmovdqa64_avx512vl(local_2d30);
                                            auVar160 = ZEXT1664(auVar62);
                                            auVar62 = vmovdqa64_avx512vl(local_2d20);
                                            auVar140 = ZEXT1664(auVar62);
                                            in_ZMM25 = ZEXT3264(local_2cc0);
                                            in_ZMM24 = ZEXT3264(local_2ca0);
                                            in_ZMM23 = ZEXT3264(local_2c80);
                                            auVar63 = vxorps_avx512vl(auVar63,auVar63);
                                            auVar159 = ZEXT1664(auVar63);
                                            auVar60 = vxorps_avx512vl(auVar60,auVar60);
                                            auVar158 = ZEXT1664(auVar60);
                                            auVar66 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                            auVar157 = ZEXT3264(auVar66);
                                            auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                            auVar156 = ZEXT3264(auVar66);
                                            auVar108 = extraout_var_00;
                                          }
                                          uVar50 = vptestmd_avx512vl(local_2d00,local_2d00);
                                          auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                          bVar58 = (bool)((byte)uVar50 & 1);
                                          bVar10 = (bool)((byte)(uVar50 >> 1) & 1);
                                          bVar11 = (bool)((byte)(uVar50 >> 2) & 1);
                                          bVar12 = (bool)((byte)(uVar50 >> 3) & 1);
                                          bVar13 = (bool)((byte)(uVar50 >> 4) & 1);
                                          bVar14 = (bool)((byte)(uVar50 >> 5) & 1);
                                          bVar15 = (bool)((byte)(uVar50 >> 6) & 1);
                                          bVar16 = SUB81(uVar50 >> 7,0);
                                          *(uint *)(local_2d60.ray + 0x100) =
                                               (uint)bVar58 * auVar66._0_4_ |
                                               (uint)!bVar58 * *(int *)(local_2d60.ray + 0x100);
                                          *(uint *)(local_2d60.ray + 0x104) =
                                               (uint)bVar10 * auVar66._4_4_ |
                                               (uint)!bVar10 * *(int *)(local_2d60.ray + 0x104);
                                          *(uint *)(local_2d60.ray + 0x108) =
                                               (uint)bVar11 * auVar66._8_4_ |
                                               (uint)!bVar11 * *(int *)(local_2d60.ray + 0x108);
                                          *(uint *)(local_2d60.ray + 0x10c) =
                                               (uint)bVar12 * auVar66._12_4_ |
                                               (uint)!bVar12 * *(int *)(local_2d60.ray + 0x10c);
                                          *(uint *)(local_2d60.ray + 0x110) =
                                               (uint)bVar13 * auVar66._16_4_ |
                                               (uint)!bVar13 * *(int *)(local_2d60.ray + 0x110);
                                          *(uint *)(local_2d60.ray + 0x114) =
                                               (uint)bVar14 * auVar66._20_4_ |
                                               (uint)!bVar14 * *(int *)(local_2d60.ray + 0x114);
                                          *(uint *)(local_2d60.ray + 0x118) =
                                               (uint)bVar15 * auVar66._24_4_ |
                                               (uint)!bVar15 * *(int *)(local_2d60.ray + 0x118);
                                          *(uint *)(local_2d60.ray + 0x11c) =
                                               (uint)bVar16 * auVar66._28_4_ |
                                               (uint)!bVar16 * *(int *)(local_2d60.ray + 0x11c);
                                        }
                                        bVar58 = (bool)((byte)uVar50 & 1);
                                        auVar81._0_4_ =
                                             (uint)bVar58 * *(int *)local_2d78 |
                                             (uint)!bVar58 * local_2b80;
                                        bVar58 = (bool)((byte)(uVar50 >> 1) & 1);
                                        auVar81._4_4_ =
                                             (uint)bVar58 * *(int *)(local_2d78 + 4) |
                                             (uint)!bVar58 * iStack_2b7c;
                                        bVar58 = (bool)((byte)(uVar50 >> 2) & 1);
                                        auVar81._8_4_ =
                                             (uint)bVar58 * *(int *)(local_2d78 + 8) |
                                             (uint)!bVar58 * iStack_2b78;
                                        bVar58 = (bool)((byte)(uVar50 >> 3) & 1);
                                        auVar81._12_4_ =
                                             (uint)bVar58 * *(int *)(local_2d78 + 0xc) |
                                             (uint)!bVar58 * iStack_2b74;
                                        bVar58 = (bool)((byte)(uVar50 >> 4) & 1);
                                        auVar81._16_4_ =
                                             (uint)bVar58 * *(int *)(local_2d78 + 0x10) |
                                             (uint)!bVar58 * iStack_2b70;
                                        bVar58 = (bool)((byte)(uVar50 >> 5) & 1);
                                        auVar81._20_4_ =
                                             (uint)bVar58 * *(int *)(local_2d78 + 0x14) |
                                             (uint)!bVar58 * iStack_2b6c;
                                        bVar58 = (bool)((byte)(uVar50 >> 6) & 1);
                                        auVar81._24_4_ =
                                             (uint)bVar58 * *(int *)(local_2d78 + 0x18) |
                                             (uint)!bVar58 * iStack_2b68;
                                        bVar58 = SUB81(uVar50 >> 7,0);
                                        auVar81._28_4_ =
                                             (uint)bVar58 * *(int *)(local_2d78 + 0x1c) |
                                             (uint)!bVar58 * iStack_2b64;
                                        *(undefined1 (*) [32])local_2d78 = auVar81;
                                        lVar51 = local_2d98;
                                        auVar70 = local_2b00;
                                        auVar71 = local_2b20;
                                        auVar72 = local_2b40;
                                        auVar69 = local_2b60;
                                      }
                                      auVar123 = ZEXT436(auVar81._28_4_);
                                      bVar46 = bVar46 & ~(byte)uVar50;
                                    }
                                  }
                                  auVar38._4_4_ = fStack_265c;
                                  auVar38._0_4_ = local_2660;
                                  auVar38._8_4_ = fStack_2658;
                                  auVar38._12_4_ = fStack_2654;
                                  auVar38._16_4_ = fStack_2650;
                                  auVar38._20_4_ = fStack_264c;
                                  auVar38._24_4_ = fStack_2648;
                                  auVar38._28_4_ = fStack_2644;
                                  auVar64 = vsubps_avx512vl(auVar70,auVar38);
                                  auVar37._4_4_ = fStack_267c;
                                  auVar37._0_4_ = local_2680;
                                  auVar37._8_4_ = fStack_2678;
                                  auVar37._12_4_ = fStack_2674;
                                  auVar37._16_4_ = fStack_2670;
                                  auVar37._20_4_ = fStack_266c;
                                  auVar37._24_4_ = fStack_2668;
                                  auVar37._28_4_ = fStack_2664;
                                  auVar68 = vsubps_avx512vl(auVar71,auVar37);
                                  auVar36._4_4_ = fStack_269c;
                                  auVar36._0_4_ = local_26a0;
                                  auVar36._8_4_ = fStack_2698;
                                  auVar36._12_4_ = fStack_2694;
                                  auVar36._16_4_ = fStack_2690;
                                  auVar36._20_4_ = fStack_268c;
                                  auVar36._24_4_ = fStack_2688;
                                  auVar36._28_4_ = fStack_2684;
                                  auVar82 = vsubps_avx512vl(auVar72,auVar36);
                                  auVar73 = vsubps_avx512vl(auVar69,auVar70);
                                  auVar74 = vsubps_avx512vl(_local_2c60,auVar71);
                                  auVar39._4_4_ = fStack_263c;
                                  auVar39._0_4_ = local_2640;
                                  auVar39._8_4_ = fStack_2638;
                                  auVar39._12_4_ = fStack_2634;
                                  auVar39._16_4_ = fStack_2630;
                                  auVar39._20_4_ = fStack_262c;
                                  auVar39._24_4_ = fStack_2628;
                                  auVar39._28_4_ = fStack_2624;
                                  auVar75 = vsubps_avx512vl(auVar39,auVar72);
                                  auVar66 = vmulps_avx512vl(auVar68,auVar75);
                                  auVar63 = vfmsub231ps_fma(auVar66,auVar74,auVar82);
                                  auVar107._0_4_ = auVar82._0_4_ * auVar73._0_4_;
                                  auVar107._4_4_ = auVar82._4_4_ * auVar73._4_4_;
                                  auVar107._8_4_ = auVar82._8_4_ * auVar73._8_4_;
                                  auVar107._12_4_ = auVar82._12_4_ * auVar73._12_4_;
                                  auVar107._16_4_ = auVar82._16_4_ * auVar73._16_4_;
                                  auVar107._20_4_ = auVar82._20_4_ * auVar73._20_4_;
                                  auVar107._24_4_ = auVar82._24_4_ * auVar73._24_4_;
                                  auVar107._28_36_ = auVar108;
                                  auVar76 = vfmsub231ps_avx512vl(auVar107._0_32_,auVar75,auVar64);
                                  auVar116._0_4_ = auVar64._0_4_ * auVar74._0_4_;
                                  auVar116._4_4_ = auVar64._4_4_ * auVar74._4_4_;
                                  auVar116._8_4_ = auVar64._8_4_ * auVar74._8_4_;
                                  auVar116._12_4_ = auVar64._12_4_ * auVar74._12_4_;
                                  auVar116._16_4_ = auVar64._16_4_ * auVar74._16_4_;
                                  auVar116._20_4_ = auVar64._20_4_ * auVar74._20_4_;
                                  auVar116._24_4_ = auVar64._24_4_ * auVar74._24_4_;
                                  auVar116._28_36_ = auVar123;
                                  auVar62 = vfmsub231ps_fma(auVar116._0_32_,auVar73,auVar68);
                                  auVar70 = vsubps_avx512vl(auVar70,*(undefined1 (*) [32])ray);
                                  auVar71 = vsubps_avx512vl(auVar71,*(undefined1 (*) [32])
                                                                     (ray + 0x20));
                                  auVar72 = vsubps_avx512vl(auVar72,*(undefined1 (*) [32])
                                                                     (ray + 0x40));
                                  auVar66 = *(undefined1 (*) [32])(ray + 0x80);
                                  auVar65 = *(undefined1 (*) [32])(ray + 0xa0);
                                  auVar67 = *(undefined1 (*) [32])(ray + 0xc0);
                                  auVar83 = vmulps_avx512vl(auVar65,auVar72);
                                  auVar61 = vfmsub231ps_fma(auVar83,auVar71,auVar67);
                                  in_ZMM12 = ZEXT1664(auVar61);
                                  auVar150._0_4_ = auVar67._0_4_ * auVar70._0_4_;
                                  auVar150._4_4_ = auVar67._4_4_ * auVar70._4_4_;
                                  auVar150._8_4_ = auVar67._8_4_ * auVar70._8_4_;
                                  auVar150._12_4_ = auVar67._12_4_ * auVar70._12_4_;
                                  auVar150._16_4_ = auVar67._16_4_ * auVar70._16_4_;
                                  auVar150._20_4_ = auVar67._20_4_ * auVar70._20_4_;
                                  auVar150._24_4_ = auVar67._24_4_ * auVar70._24_4_;
                                  auVar150._28_36_ = auVar151;
                                  auVar91 = vfmsub231ps_fma(auVar150._0_32_,auVar72,auVar66);
                                  in_ZMM13 = ZEXT1664(auVar91);
                                  auVar153._0_4_ = auVar66._0_4_ * auVar71._0_4_;
                                  auVar153._4_4_ = auVar66._4_4_ * auVar71._4_4_;
                                  auVar153._8_4_ = auVar66._8_4_ * auVar71._8_4_;
                                  auVar153._12_4_ = auVar66._12_4_ * auVar71._12_4_;
                                  auVar153._16_4_ = auVar66._16_4_ * auVar71._16_4_;
                                  auVar153._20_4_ = auVar66._20_4_ * auVar71._20_4_;
                                  auVar153._24_4_ = auVar66._24_4_ * auVar71._24_4_;
                                  auVar153._28_36_ = auVar154;
                                  auVar83 = vfmsub231ps_avx512vl(auVar153._0_32_,auVar70,auVar65);
                                  in_ZMM14 = ZEXT3264(auVar83);
                                  auVar27._4_4_ = auVar62._4_4_ * auVar67._4_4_;
                                  auVar27._0_4_ = auVar62._0_4_ * auVar67._0_4_;
                                  auVar27._8_4_ = auVar62._8_4_ * auVar67._8_4_;
                                  auVar27._12_4_ = auVar62._12_4_ * auVar67._12_4_;
                                  auVar27._16_4_ = auVar67._16_4_ * 0.0;
                                  auVar27._20_4_ = auVar67._20_4_ * 0.0;
                                  auVar27._24_4_ = auVar67._24_4_ * 0.0;
                                  auVar27._28_4_ = auVar67._28_4_;
                                  auVar65 = vfmadd231ps_avx512vl(auVar27,auVar76,auVar65);
                                  auVar60 = vfmadd231ps_fma(auVar65,ZEXT1632(auVar63),auVar66);
                                  vandps_avx512vl(ZEXT1632(auVar60),auVar157._0_32_);
                                  auVar66 = vmulps_avx512vl(auVar75,auVar83);
                                  auVar66 = vfmadd231ps_avx512vl(auVar66,ZEXT1632(auVar91),auVar74);
                                  auVar66 = vfmadd231ps_avx512vl(auVar66,ZEXT1632(auVar61),auVar73);
                                  auVar66 = vxorps_avx512vl(auVar65,auVar66);
                                  uVar17 = vcmpps_avx512vl(auVar66,auVar158._0_32_,5);
                                  bVar40 = (byte)uVar17 & bVar46;
                                  if (bVar40 == 0) {
LAB_007bd202:
                                    uVar42 = 0;
                                  }
                                  else {
                                    auVar31._4_4_ = auVar82._4_4_ * auVar83._4_4_;
                                    auVar31._0_4_ = auVar82._0_4_ * auVar83._0_4_;
                                    auVar31._8_4_ = auVar82._8_4_ * auVar83._8_4_;
                                    auVar31._12_4_ = auVar82._12_4_ * auVar83._12_4_;
                                    auVar31._16_4_ = auVar82._16_4_ * auVar83._16_4_;
                                    auVar31._20_4_ = auVar82._20_4_ * auVar83._20_4_;
                                    auVar31._24_4_ = auVar82._24_4_ * auVar83._24_4_;
                                    auVar31._28_4_ = auVar82._28_4_;
                                    auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar68,auVar31);
                                    in_ZMM13 = ZEXT1664(auVar91);
                                    auVar61 = vfmadd213ps_fma(ZEXT1632(auVar61),auVar64,
                                                              ZEXT1632(auVar91));
                                    in_ZMM12 = ZEXT1664(auVar61);
                                    auVar139._0_4_ = auVar65._0_4_ ^ auVar61._0_4_;
                                    auVar139._4_4_ = auVar65._4_4_ ^ auVar61._4_4_;
                                    auVar139._8_4_ = auVar65._8_4_ ^ auVar61._8_4_;
                                    auVar139._12_4_ = auVar65._12_4_ ^ auVar61._12_4_;
                                    auVar139._16_4_ = auVar65._16_4_;
                                    auVar139._20_4_ = auVar65._20_4_;
                                    auVar139._24_4_ = auVar65._24_4_;
                                    auVar139._28_4_ = auVar65._28_4_;
                                    uVar17 = vcmpps_avx512vl(auVar139,auVar158._0_32_,5);
                                    bVar40 = bVar40 & (byte)uVar17;
                                    if (bVar40 == 0) goto LAB_007bd202;
                                    auVar24._8_4_ = 0x7fffffff;
                                    auVar24._0_8_ = 0x7fffffff7fffffff;
                                    auVar24._12_4_ = 0x7fffffff;
                                    auVar24._16_4_ = 0x7fffffff;
                                    auVar24._20_4_ = 0x7fffffff;
                                    auVar24._24_4_ = 0x7fffffff;
                                    auVar24._28_4_ = 0x7fffffff;
                                    vandps_avx512vl(ZEXT1632(auVar60),auVar24);
                                    auVar67 = vsubps_avx(auVar66,auVar66);
                                    uVar17 = vcmpps_avx512vl(auVar67,auVar139,5);
                                    bVar40 = bVar40 & (byte)uVar17;
                                    if (bVar40 == 0) goto LAB_007bd202;
                                    auVar32._4_4_ = auVar62._4_4_ * auVar72._4_4_;
                                    auVar32._0_4_ = auVar62._0_4_ * auVar72._0_4_;
                                    auVar32._8_4_ = auVar62._8_4_ * auVar72._8_4_;
                                    auVar32._12_4_ = auVar62._12_4_ * auVar72._12_4_;
                                    auVar32._16_4_ = auVar72._16_4_ * 0.0;
                                    auVar32._20_4_ = auVar72._20_4_ * 0.0;
                                    auVar32._24_4_ = auVar72._24_4_ * 0.0;
                                    auVar32._28_4_ = auVar72._28_4_;
                                    auVar61 = vfmadd213ps_fma(auVar71,auVar76,auVar32);
                                    auVar61 = vfmadd213ps_fma(auVar70,ZEXT1632(auVar63),
                                                              ZEXT1632(auVar61));
                                    auVar133._0_4_ = auVar66._0_4_ * *(float *)(ray + 0x60);
                                    auVar133._4_4_ = auVar66._4_4_ * *(float *)(ray + 100);
                                    auVar133._8_4_ = auVar66._8_4_ * *(float *)(ray + 0x68);
                                    auVar133._12_4_ = auVar66._12_4_ * *(float *)(ray + 0x6c);
                                    auVar133._16_4_ = auVar66._16_4_ * *(float *)(ray + 0x70);
                                    auVar133._20_4_ = auVar66._20_4_ * *(float *)(ray + 0x74);
                                    auVar133._24_4_ = auVar66._24_4_ * *(float *)(ray + 0x78);
                                    auVar133._28_4_ = 0;
                                    auVar127._0_4_ = auVar65._0_4_ ^ auVar61._0_4_;
                                    auVar127._4_4_ = auVar65._4_4_ ^ auVar61._4_4_;
                                    auVar127._8_4_ = auVar65._8_4_ ^ auVar61._8_4_;
                                    auVar127._12_4_ = auVar65._12_4_ ^ auVar61._12_4_;
                                    auVar127._16_4_ = auVar65._16_4_;
                                    auVar127._20_4_ = auVar65._20_4_;
                                    auVar127._24_4_ = auVar65._24_4_;
                                    auVar127._28_4_ = auVar65._28_4_;
                                    auVar33._4_4_ = auVar66._4_4_ * *(float *)(ray + 0x104);
                                    auVar33._0_4_ = auVar66._0_4_ * *(float *)(ray + 0x100);
                                    auVar33._8_4_ = auVar66._8_4_ * *(float *)(ray + 0x108);
                                    auVar33._12_4_ = auVar66._12_4_ * *(float *)(ray + 0x10c);
                                    auVar33._16_4_ = auVar66._16_4_ * *(float *)(ray + 0x110);
                                    auVar33._20_4_ = auVar66._20_4_ * *(float *)(ray + 0x114);
                                    auVar33._24_4_ = auVar66._24_4_ * *(float *)(ray + 0x118);
                                    auVar33._28_4_ = auVar72._28_4_;
                                    uVar17 = vcmpps_avx512vl(auVar127,auVar33,2);
                                    uVar18 = vcmpps_avx512vl(auVar133,auVar127,1);
                                    bVar40 = bVar40 & (byte)uVar17 & (byte)uVar18;
                                    if (bVar40 == 0) {
                                      uVar42 = 0;
                                    }
                                    else {
                                      uVar17 = vcmpps_avx512vl(ZEXT1632(auVar60),ZEXT832(0) << 0x20,
                                                               4);
                                      bVar40 = bVar40 & (byte)uVar17;
                                      uVar42 = (uint)bVar40;
                                      if (bVar40 != 0) {
                                        in_ZMM23 = ZEXT3264(auVar66);
                                        in_ZMM24 = ZEXT3264(auVar139);
                                        local_2ba0 = auVar127;
                                        in_ZMM25 = ZEXT3264(auVar66);
                                        local_2bc0 = ZEXT1632(auVar63);
                                        local_2be0 = auVar76;
                                        local_2c00 = ZEXT1632(auVar62);
                                      }
                                    }
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar156 = ZEXT3264(auVar66);
                                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar157 = ZEXT3264(auVar66);
                                    auVar60 = vxorps_avx512vl(auVar158._0_16_,auVar158._0_16_);
                                    auVar158 = ZEXT1664(auVar60);
                                    auVar60 = vxorps_avx512vl(auVar159._0_16_,auVar159._0_16_);
                                    auVar159 = ZEXT1664(auVar60);
                                  }
                                  auVar60 = auVar158._0_16_;
                                  auVar63 = auVar159._0_16_;
                                  bVar40 = (byte)uVar42;
                                  if (bVar40 != 0) {
                                    local_2cc0 = in_ZMM25._0_32_;
                                    auVar66 = vsubps_avx512vl(local_2cc0,in_ZMM23._0_32_);
                                    auVar65 = vsubps_avx512vl(local_2cc0,in_ZMM24._0_32_);
                                    auVar91 = auVar69._0_16_;
                                    auVar62 = vcvtsi2ss_avx512f(auVar91,*(ushort *)
                                                                         (lVar51 + 8 + lVar45) - 1);
                                    auVar85._16_16_ = auVar65._16_16_;
                                    auVar85._0_16_ = auVar63;
                                    auVar84._4_28_ = auVar85._4_28_;
                                    auVar84._0_4_ = auVar62._0_4_;
                                    auVar61 = vrcp14ss_avx512f(auVar63,auVar84._0_16_);
                                    auVar62 = vfnmadd213ss_avx512f
                                                        (auVar62,auVar61,
                                                         SUB6416(ZEXT464(0x40000000),0));
                                    fVar118 = auVar61._0_4_ * auVar62._0_4_;
                                    auVar62 = vcvtsi2ss_avx512f(auVar91,*(ushort *)
                                                                         (lVar51 + 10 + lVar45) - 1)
                                    ;
                                    auVar87._16_16_ = auVar85._16_16_;
                                    auVar87._0_16_ = auVar63;
                                    auVar86._4_28_ = auVar87._4_28_;
                                    auVar86._0_4_ = auVar62._0_4_;
                                    auVar61 = vrcp14ss_avx512f(auVar63,auVar86._0_16_);
                                    auVar62 = vfnmadd213ss_avx512f
                                                        (auVar62,auVar61,
                                                         SUB6416(ZEXT464(0x40000000),0));
                                    fVar119 = auVar61._0_4_ * auVar62._0_4_;
                                    auVar62 = vcvtsi2ss_avx512f(auVar91,((uint)uVar59 & 1) +
                                                                        local_2d8c);
                                    auVar115._0_4_ = auVar62._0_4_;
                                    auVar115._4_4_ = auVar115._0_4_;
                                    auVar115._8_4_ = auVar115._0_4_;
                                    auVar115._12_4_ = auVar115._0_4_;
                                    auVar115._16_4_ = auVar115._0_4_;
                                    auVar115._20_4_ = auVar115._0_4_;
                                    auVar115._24_4_ = auVar115._0_4_;
                                    auVar115._28_4_ = auVar115._0_4_;
                                    auVar67 = vmulps_avx512vl(auVar115,local_2cc0);
                                    auVar67 = vaddps_avx512vl(auVar66,auVar67);
                                    auVar98._4_4_ = fVar118;
                                    auVar98._0_4_ = fVar118;
                                    auVar98._8_4_ = fVar118;
                                    auVar98._12_4_ = fVar118;
                                    auVar98._16_4_ = fVar118;
                                    auVar98._20_4_ = fVar118;
                                    auVar98._24_4_ = fVar118;
                                    auVar98._28_4_ = fVar118;
                                    auVar67 = vmulps_avx512vl(auVar67,auVar98);
                                    local_2c80._0_4_ =
                                         (uint)(bVar40 & 1) * auVar67._0_4_ |
                                         (uint)!(bool)(bVar40 & 1) * auVar66._0_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 1) & 1);
                                    local_2c80._4_4_ =
                                         (uint)bVar58 * auVar67._4_4_ |
                                         (uint)!bVar58 * auVar66._4_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 2) & 1);
                                    local_2c80._8_4_ =
                                         (uint)bVar58 * auVar67._8_4_ |
                                         (uint)!bVar58 * auVar66._8_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 3) & 1);
                                    local_2c80._12_4_ =
                                         (uint)bVar58 * auVar67._12_4_ |
                                         (uint)!bVar58 * auVar66._12_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 4) & 1);
                                    local_2c80._16_4_ =
                                         (uint)bVar58 * auVar67._16_4_ |
                                         (uint)!bVar58 * auVar66._16_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 5) & 1);
                                    local_2c80._20_4_ =
                                         (uint)bVar58 * auVar67._20_4_ |
                                         (uint)!bVar58 * auVar66._20_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 6) & 1);
                                    local_2c80._24_4_ =
                                         (uint)bVar58 * auVar67._24_4_ |
                                         (uint)!bVar58 * auVar66._24_4_;
                                    local_2c80._28_4_ =
                                         (uVar42 >> 7) * auVar67._28_4_ |
                                         (uint)!SUB41(uVar42 >> 7,0) * auVar66._28_4_;
                                    in_ZMM23 = ZEXT3264(local_2c80);
                                    auVar62 = vcvtsi2ss_avx512f(auVar91,((uint)(uVar59 >> 1) &
                                                                        0x7fffffff) + local_2d90);
                                    auVar99._0_4_ = auVar62._0_4_;
                                    auVar99._4_4_ = auVar99._0_4_;
                                    auVar99._8_4_ = auVar99._0_4_;
                                    auVar99._12_4_ = auVar99._0_4_;
                                    auVar99._16_4_ = auVar99._0_4_;
                                    auVar99._20_4_ = auVar99._0_4_;
                                    auVar99._24_4_ = auVar99._0_4_;
                                    auVar99._28_4_ = auVar99._0_4_;
                                    auVar66 = vmulps_avx512vl(auVar99,local_2cc0);
                                    auVar66 = vaddps_avx512vl(auVar65,auVar66);
                                    auVar106._4_4_ = fVar119;
                                    auVar106._0_4_ = fVar119;
                                    auVar106._8_4_ = fVar119;
                                    auVar106._12_4_ = fVar119;
                                    auVar106._16_4_ = fVar119;
                                    auVar106._20_4_ = fVar119;
                                    auVar106._24_4_ = fVar119;
                                    auVar106._28_4_ = fVar119;
                                    auVar66 = vmulps_avx512vl(auVar66,auVar106);
                                    local_2ca0._0_4_ =
                                         (uint)(bVar40 & 1) * auVar66._0_4_ |
                                         (uint)!(bool)(bVar40 & 1) * auVar65._0_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 1) & 1);
                                    local_2ca0._4_4_ =
                                         (uint)bVar58 * auVar66._4_4_ |
                                         (uint)!bVar58 * auVar65._4_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 2) & 1);
                                    local_2ca0._8_4_ =
                                         (uint)bVar58 * auVar66._8_4_ |
                                         (uint)!bVar58 * auVar65._8_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 3) & 1);
                                    local_2ca0._12_4_ =
                                         (uint)bVar58 * auVar66._12_4_ |
                                         (uint)!bVar58 * auVar65._12_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 4) & 1);
                                    local_2ca0._16_4_ =
                                         (uint)bVar58 * auVar66._16_4_ |
                                         (uint)!bVar58 * auVar65._16_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 5) & 1);
                                    local_2ca0._20_4_ =
                                         (uint)bVar58 * auVar66._20_4_ |
                                         (uint)!bVar58 * auVar65._20_4_;
                                    bVar58 = (bool)((byte)(uVar42 >> 6) & 1);
                                    local_2ca0._24_4_ =
                                         (uint)bVar58 * auVar66._24_4_ |
                                         (uint)!bVar58 * auVar65._24_4_;
                                    local_2ca0._28_4_ =
                                         (uVar42 >> 7) * auVar66._28_4_ |
                                         (uint)!SUB41(uVar42 >> 7,0) * auVar65._28_4_;
                                    in_ZMM24 = ZEXT3264(local_2ca0);
                                    pGVar6 = (context->scene->geometries).items
                                             [*(uint *)(local_2cd0 + uVar59 * 4)].ptr;
                                    uVar42 = pGVar6->mask;
                                    auVar100._4_4_ = uVar42;
                                    auVar100._0_4_ = uVar42;
                                    auVar100._8_4_ = uVar42;
                                    auVar100._12_4_ = uVar42;
                                    auVar100._16_4_ = uVar42;
                                    auVar100._20_4_ = uVar42;
                                    auVar100._24_4_ = uVar42;
                                    auVar100._28_4_ = uVar42;
                                    uVar17 = vptestmd_avx512vl(auVar100,*(undefined1 (*) [32])
                                                                         (ray + 0x120));
                                    bVar40 = (byte)uVar17 & bVar40;
                                    uVar50 = (ulong)bVar40;
                                    if (bVar40 != 0) {
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                        auVar66 = vrcp14ps_avx512vl(local_2cc0);
                                        auVar23._8_4_ = 0x3f800000;
                                        auVar23._0_8_ = &DAT_3f8000003f800000;
                                        auVar23._12_4_ = 0x3f800000;
                                        auVar23._16_4_ = 0x3f800000;
                                        auVar23._20_4_ = 0x3f800000;
                                        auVar23._24_4_ = 0x3f800000;
                                        auVar23._28_4_ = 0x3f800000;
                                        auVar65 = vfnmadd213ps_avx512vl(auVar66,local_2cc0,auVar23);
                                        auVar62 = vfmadd132ps_fma(auVar65,auVar66,auVar66);
                                        local_2a80 = vmulps_avx512vl(local_2c80,ZEXT1632(auVar62));
                                        local_2a60 = vmulps_avx512vl(local_2ca0,ZEXT1632(auVar62));
                                        pRVar9 = context->user;
                                        local_2a20 = vpbroadcastd_avx512vl();
                                        local_2a40 = vpbroadcastd_avx512vl();
                                        local_2ae0 = local_2bc0._0_16_;
                                        uStack_2ad0 = local_2bc0._16_8_;
                                        uStack_2ac8 = local_2bc0._24_8_;
                                        local_2ac0 = local_2be0._0_8_;
                                        uStack_2ab8 = local_2be0._8_8_;
                                        uStack_2ab0 = local_2be0._16_8_;
                                        uStack_2aa8 = local_2be0._24_8_;
                                        local_2aa0 = local_2c00._0_8_;
                                        uStack_2a98 = local_2c00._8_8_;
                                        uStack_2a90 = local_2c00._16_8_;
                                        uStack_2a88 = local_2c00._24_8_;
                                        auVar66 = vpcmpeqd_avx2(local_2a80,local_2a80);
                                        local_2d08[1] = auVar66;
                                        *local_2d08 = auVar66;
                                        local_2a00 = pRVar9->instID[0];
                                        uStack_29fc = local_2a00;
                                        uStack_29f8 = local_2a00;
                                        uStack_29f4 = local_2a00;
                                        uStack_29f0 = local_2a00;
                                        uStack_29ec = local_2a00;
                                        uStack_29e8 = local_2a00;
                                        uStack_29e4 = local_2a00;
                                        local_29e0 = pRVar9->instPrimID[0];
                                        uStack_29dc = local_29e0;
                                        uStack_29d8 = local_29e0;
                                        uStack_29d4 = local_29e0;
                                        uStack_29d0 = local_29e0;
                                        uStack_29cc = local_29e0;
                                        uStack_29c8 = local_29e0;
                                        uStack_29c4 = local_29e0;
                                        iVar43 = *(int *)(ray + 0x100);
                                        iVar117 = *(int *)(ray + 0x104);
                                        fVar118 = *(float *)(ray + 0x108);
                                        fVar119 = *(float *)(ray + 0x10c);
                                        fVar120 = *(float *)(ray + 0x110);
                                        fVar121 = *(float *)(ray + 0x114);
                                        fVar109 = *(float *)(ray + 0x118);
                                        fVar122 = *(float *)(ray + 0x11c);
                                        _local_2c60 = *(undefined1 (*) [32])(ray + 0x100);
                                        auVar66 = vmulps_avx512vl(ZEXT1632(auVar62),local_2ba0);
                                        bVar58 = (bool)(bVar40 >> 1 & 1);
                                        bVar10 = (bool)(bVar40 >> 2 & 1);
                                        bVar11 = (bool)(bVar40 >> 3 & 1);
                                        bVar12 = (bool)(bVar40 >> 4 & 1);
                                        bVar13 = (bool)(bVar40 >> 5 & 1);
                                        bVar14 = (bool)(bVar40 >> 6 & 1);
                                        *(uint *)(ray + 0x100) =
                                             (uint)(bVar40 & 1) * auVar66._0_4_ |
                                             (uint)!(bool)(bVar40 & 1) * iVar43;
                                        *(uint *)(ray + 0x104) =
                                             (uint)bVar58 * auVar66._4_4_ | (uint)!bVar58 * iVar117;
                                        *(uint *)(ray + 0x108) =
                                             (uint)bVar10 * auVar66._8_4_ |
                                             (uint)!bVar10 * (int)fVar118;
                                        *(uint *)(ray + 0x10c) =
                                             (uint)bVar11 * auVar66._12_4_ |
                                             (uint)!bVar11 * (int)fVar119;
                                        *(uint *)(ray + 0x110) =
                                             (uint)bVar12 * auVar66._16_4_ |
                                             (uint)!bVar12 * (int)fVar120;
                                        *(uint *)(ray + 0x114) =
                                             (uint)bVar13 * auVar66._20_4_ |
                                             (uint)!bVar13 * (int)fVar121;
                                        *(uint *)(ray + 0x118) =
                                             (uint)bVar14 * auVar66._24_4_ |
                                             (uint)!bVar14 * (int)fVar109;
                                        *(uint *)(ray + 0x11c) =
                                             (uint)(bVar40 >> 7) * auVar66._28_4_ |
                                             (uint)!(bool)(bVar40 >> 7) * (int)fVar122;
                                        local_2d00 = vpmovm2d_avx512vl((ulong)bVar40);
                                        local_2d60.geometryUserPtr = pGVar6->userPtr;
                                        local_2d60.valid = (int *)local_2d00;
                                        local_2d60.context = context->user;
                                        local_2d60.ray = (RTCRayN *)ray;
                                        local_2d60.hit = local_2ae0;
                                        local_2d60.N = 8;
                                        local_2d20 = vmovdqa64_avx512vl(auVar140._0_16_);
                                        local_2d30 = vmovdqa64_avx512vl(auVar160._0_16_);
                                        local_2d98 = lVar51;
                                        if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                          in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                                          in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                          in_ZMM14 = ZEXT1664(auVar83._0_16_);
                                          local_2d80 = lVar45;
                                          (*pGVar6->occlusionFilterN)(&local_2d60);
                                          auVar62 = vmovdqa64_avx512vl(local_2d30);
                                          auVar160 = ZEXT1664(auVar62);
                                          auVar62 = vmovdqa64_avx512vl(local_2d20);
                                          auVar140 = ZEXT1664(auVar62);
                                          in_ZMM25 = ZEXT3264(local_2cc0);
                                          in_ZMM24 = ZEXT3264(local_2ca0);
                                          in_ZMM23 = ZEXT3264(local_2c80);
                                          auVar63 = vxorps_avx512vl(auVar63,auVar63);
                                          auVar159 = ZEXT1664(auVar63);
                                          auVar60 = vxorps_avx512vl(auVar60,auVar60);
                                          auVar158 = ZEXT1664(auVar60);
                                          auVar66 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar157 = ZEXT3264(auVar66);
                                          auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar156 = ZEXT3264(auVar66);
                                          lVar45 = local_2d80;
                                          iVar43 = local_2c60._0_4_;
                                          iVar117 = local_2c60._4_4_;
                                          fVar118 = fStack_2c58;
                                          fVar119 = fStack_2c54;
                                          fVar120 = fStack_2c50;
                                          fVar121 = fStack_2c4c;
                                          fVar109 = fStack_2c48;
                                          fVar122 = fStack_2c44;
                                        }
                                        auVar60 = auVar158._0_16_;
                                        auVar63 = auVar159._0_16_;
                                        uVar50 = vptestmd_avx512vl(local_2d00,local_2d00);
                                        if ((char)uVar50 != '\0') {
                                          p_Var8 = context->args->filter;
                                          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                                            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                            (*p_Var8)(&local_2d60);
                                            auVar62 = vmovdqa64_avx512vl(local_2d30);
                                            auVar160 = ZEXT1664(auVar62);
                                            auVar62 = vmovdqa64_avx512vl(local_2d20);
                                            auVar140 = ZEXT1664(auVar62);
                                            in_ZMM25 = ZEXT3264(local_2cc0);
                                            in_ZMM24 = ZEXT3264(local_2ca0);
                                            in_ZMM23 = ZEXT3264(local_2c80);
                                            auVar63 = vxorps_avx512vl(auVar63,auVar63);
                                            auVar159 = ZEXT1664(auVar63);
                                            auVar60 = vxorps_avx512vl(auVar60,auVar60);
                                            auVar158 = ZEXT1664(auVar60);
                                            auVar66 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                            auVar157 = ZEXT3264(auVar66);
                                            auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                            auVar156 = ZEXT3264(auVar66);
                                            iVar43 = local_2c60._0_4_;
                                            iVar117 = local_2c60._4_4_;
                                            fVar118 = fStack_2c58;
                                            fVar119 = fStack_2c54;
                                            fVar120 = fStack_2c50;
                                            fVar121 = fStack_2c4c;
                                            fVar109 = fStack_2c48;
                                            fVar122 = fStack_2c44;
                                          }
                                          uVar50 = vptestmd_avx512vl(local_2d00,local_2d00);
                                          auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                          bVar58 = (bool)((byte)uVar50 & 1);
                                          auVar88._0_4_ =
                                               (uint)bVar58 * auVar66._0_4_ |
                                               (uint)!bVar58 * *(int *)(local_2d60.ray + 0x100);
                                          bVar58 = (bool)((byte)(uVar50 >> 1) & 1);
                                          auVar88._4_4_ =
                                               (uint)bVar58 * auVar66._4_4_ |
                                               (uint)!bVar58 * *(int *)(local_2d60.ray + 0x104);
                                          bVar58 = (bool)((byte)(uVar50 >> 2) & 1);
                                          auVar88._8_4_ =
                                               (uint)bVar58 * auVar66._8_4_ |
                                               (uint)!bVar58 * *(int *)(local_2d60.ray + 0x108);
                                          bVar58 = (bool)((byte)(uVar50 >> 3) & 1);
                                          auVar88._12_4_ =
                                               (uint)bVar58 * auVar66._12_4_ |
                                               (uint)!bVar58 * *(int *)(local_2d60.ray + 0x10c);
                                          bVar58 = (bool)((byte)(uVar50 >> 4) & 1);
                                          auVar88._16_4_ =
                                               (uint)bVar58 * auVar66._16_4_ |
                                               (uint)!bVar58 * *(int *)(local_2d60.ray + 0x110);
                                          bVar58 = (bool)((byte)(uVar50 >> 5) & 1);
                                          auVar88._20_4_ =
                                               (uint)bVar58 * auVar66._20_4_ |
                                               (uint)!bVar58 * *(int *)(local_2d60.ray + 0x114);
                                          bVar58 = (bool)((byte)(uVar50 >> 6) & 1);
                                          auVar88._24_4_ =
                                               (uint)bVar58 * auVar66._24_4_ |
                                               (uint)!bVar58 * *(int *)(local_2d60.ray + 0x118);
                                          bVar58 = SUB81(uVar50 >> 7,0);
                                          auVar88._28_4_ =
                                               (uint)bVar58 * auVar66._28_4_ |
                                               (uint)!bVar58 * *(int *)(local_2d60.ray + 0x11c);
                                          *(undefined1 (*) [32])(local_2d60.ray + 0x100) = auVar88;
                                        }
                                        bVar58 = (bool)((byte)uVar50 & 1);
                                        auVar89._0_4_ =
                                             (uint)bVar58 * *(int *)local_2d78 |
                                             (uint)!bVar58 * iVar43;
                                        bVar58 = (bool)((byte)(uVar50 >> 1) & 1);
                                        auVar89._4_4_ =
                                             (uint)bVar58 * *(int *)(local_2d78 + 4) |
                                             (uint)!bVar58 * iVar117;
                                        bVar58 = (bool)((byte)(uVar50 >> 2) & 1);
                                        auVar89._8_4_ =
                                             (uint)bVar58 * *(int *)(local_2d78 + 8) |
                                             (uint)!bVar58 * (int)fVar118;
                                        bVar58 = (bool)((byte)(uVar50 >> 3) & 1);
                                        auVar89._12_4_ =
                                             (uint)bVar58 * *(int *)(local_2d78 + 0xc) |
                                             (uint)!bVar58 * (int)fVar119;
                                        bVar58 = (bool)((byte)(uVar50 >> 4) & 1);
                                        auVar89._16_4_ =
                                             (uint)bVar58 * *(int *)(local_2d78 + 0x10) |
                                             (uint)!bVar58 * (int)fVar120;
                                        bVar58 = (bool)((byte)(uVar50 >> 5) & 1);
                                        auVar89._20_4_ =
                                             (uint)bVar58 * *(int *)(local_2d78 + 0x14) |
                                             (uint)!bVar58 * (int)fVar121;
                                        bVar58 = (bool)((byte)(uVar50 >> 6) & 1);
                                        auVar89._24_4_ =
                                             (uint)bVar58 * *(int *)(local_2d78 + 0x18) |
                                             (uint)!bVar58 * (int)fVar109;
                                        bVar58 = SUB81(uVar50 >> 7,0);
                                        auVar89._28_4_ =
                                             (uint)bVar58 * *(int *)(local_2d78 + 0x1c) |
                                             (uint)!bVar58 * (int)fVar122;
                                        *(undefined1 (*) [32])local_2d78 = auVar89;
                                        lVar51 = local_2d98;
                                      }
                                      bVar46 = bVar46 & ~(byte)uVar50;
                                    }
                                  }
                                  if (bVar46 == 0) break;
                                  pfVar49 = pfVar49 + 0x10;
                                  bVar58 = uVar59 < 3;
                                  uVar59 = uVar59 + 1;
                                } while (bVar58);
                                bVar53 = bVar53 & bVar46;
                                bVar58 = bVar53 == 0;
                                lVar47 = local_2c10;
                                uVar50 = local_2c08;
                                uVar59 = local_2d70;
                                puVar52 = local_2d88;
                              }
                            } while ((!bVar58) && (uVar50 = uVar50 - 1 & uVar50, uVar50 != 0));
                          }
                          lVar47 = local_2c18 + 1;
                        } while (lVar47 != local_2c20);
                        bVar53 = ~bVar53;
                      }
                      bVar41 = bVar41 | bVar53;
                      if (bVar41 == 0xff) goto LAB_007bdc5d;
                      auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      local_27c0._0_4_ =
                           (uint)(bVar41 & 1) * auVar66._0_4_ |
                           (uint)!(bool)(bVar41 & 1) * local_27c0._0_4_;
                      bVar58 = (bool)(bVar41 >> 1 & 1);
                      local_27c0._4_4_ =
                           (uint)bVar58 * auVar66._4_4_ | (uint)!bVar58 * local_27c0._4_4_;
                      bVar58 = (bool)(bVar41 >> 2 & 1);
                      local_27c0._8_4_ =
                           (uint)bVar58 * auVar66._8_4_ | (uint)!bVar58 * local_27c0._8_4_;
                      bVar58 = (bool)(bVar41 >> 3 & 1);
                      local_27c0._12_4_ =
                           (uint)bVar58 * auVar66._12_4_ | (uint)!bVar58 * local_27c0._12_4_;
                      bVar58 = (bool)(bVar41 >> 4 & 1);
                      local_27c0._16_4_ =
                           (uint)bVar58 * auVar66._16_4_ | (uint)!bVar58 * local_27c0._16_4_;
                      bVar58 = (bool)(bVar41 >> 5 & 1);
                      local_27c0._20_4_ =
                           (uint)bVar58 * auVar66._20_4_ | (uint)!bVar58 * local_27c0._20_4_;
                      bVar58 = (bool)(bVar41 >> 6 & 1);
                      local_27c0._24_4_ =
                           (uint)bVar58 * auVar66._24_4_ | (uint)!bVar58 * local_27c0._24_4_;
                      local_27c0._28_4_ =
                           (uint)(bVar41 >> 7) * auVar66._28_4_ |
                           (uint)!(bool)(bVar41 >> 7) * local_27c0._28_4_;
                      iVar43 = 0;
                      break;
                    }
                    goto LAB_007bdc6e;
                  }
                  auVar140 = ZEXT3264(auVar156._0_32_);
                  uVar56 = 0;
                  uVar50 = 8;
                  do {
                    uVar44 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar56 * 8);
                    if (uVar44 != 8) {
                      auVar34._4_4_ = fStack_289c;
                      auVar34._0_4_ = local_28a0;
                      auVar34._8_4_ = fStack_2898;
                      auVar34._12_4_ = fStack_2894;
                      auVar34._16_4_ = fStack_2890;
                      auVar34._20_4_ = fStack_288c;
                      auVar34._24_4_ = fStack_2888;
                      auVar34._28_4_ = uStack_2884;
                      uVar57 = *(undefined4 *)(root.ptr + 0x20 + uVar56 * 4);
                      auVar128._4_4_ = uVar57;
                      auVar128._0_4_ = uVar57;
                      auVar128._8_4_ = uVar57;
                      auVar128._12_4_ = uVar57;
                      auVar128._16_4_ = uVar57;
                      auVar128._20_4_ = uVar57;
                      auVar128._24_4_ = uVar57;
                      auVar128._28_4_ = uVar57;
                      auVar60 = vfmsub132ps_fma(auVar128,auVar34,local_2900);
                      auVar35._4_4_ = fStack_287c;
                      auVar35._0_4_ = local_2880;
                      auVar35._8_4_ = fStack_2878;
                      auVar35._12_4_ = fStack_2874;
                      auVar35._16_4_ = fStack_2870;
                      auVar35._20_4_ = fStack_286c;
                      auVar35._24_4_ = fStack_2868;
                      auVar35._28_4_ = uStack_2864;
                      uVar57 = *(undefined4 *)(root.ptr + 0x40 + uVar56 * 4);
                      auVar134._4_4_ = uVar57;
                      auVar134._0_4_ = uVar57;
                      auVar134._8_4_ = uVar57;
                      auVar134._12_4_ = uVar57;
                      auVar134._16_4_ = uVar57;
                      auVar134._20_4_ = uVar57;
                      auVar134._24_4_ = uVar57;
                      auVar134._28_4_ = uVar57;
                      uVar57 = *(undefined4 *)(root.ptr + 0x60 + uVar56 * 4);
                      auVar137._4_4_ = uVar57;
                      auVar137._0_4_ = uVar57;
                      auVar137._8_4_ = uVar57;
                      auVar137._12_4_ = uVar57;
                      auVar137._16_4_ = uVar57;
                      auVar137._20_4_ = uVar57;
                      auVar137._24_4_ = uVar57;
                      auVar137._28_4_ = uVar57;
                      auVar63 = vfmsub132ps_fma(auVar134,auVar35,local_28e0);
                      auVar62 = vfmsub132ps_fma(auVar137,local_2860,local_28c0);
                      uVar57 = *(undefined4 *)(root.ptr + 0x30 + uVar56 * 4);
                      auVar20._4_4_ = uVar57;
                      auVar20._0_4_ = uVar57;
                      auVar20._8_4_ = uVar57;
                      auVar20._12_4_ = uVar57;
                      auVar20._16_4_ = uVar57;
                      auVar20._20_4_ = uVar57;
                      auVar20._24_4_ = uVar57;
                      auVar20._28_4_ = uVar57;
                      auVar67 = vfmsub132ps_avx512vl(local_2900,auVar34,auVar20);
                      uVar57 = *(undefined4 *)(root.ptr + 0x50 + uVar56 * 4);
                      auVar21._4_4_ = uVar57;
                      auVar21._0_4_ = uVar57;
                      auVar21._8_4_ = uVar57;
                      auVar21._12_4_ = uVar57;
                      auVar21._16_4_ = uVar57;
                      auVar21._20_4_ = uVar57;
                      auVar21._24_4_ = uVar57;
                      auVar21._28_4_ = uVar57;
                      auVar64 = vfmsub132ps_avx512vl(local_28e0,auVar35,auVar21);
                      uVar57 = *(undefined4 *)(root.ptr + 0x70 + uVar56 * 4);
                      auVar22._4_4_ = uVar57;
                      auVar22._0_4_ = uVar57;
                      auVar22._8_4_ = uVar57;
                      auVar22._12_4_ = uVar57;
                      auVar22._16_4_ = uVar57;
                      auVar22._20_4_ = uVar57;
                      auVar22._24_4_ = uVar57;
                      auVar22._28_4_ = uVar57;
                      auVar68 = vfmsub132ps_avx512vl(local_28c0,local_2860,auVar22);
                      auVar66 = vpminsd_avx2(ZEXT1632(auVar60),auVar67);
                      auVar65 = vpminsd_avx2(ZEXT1632(auVar63),auVar64);
                      auVar66 = vpmaxsd_avx2(auVar66,auVar65);
                      auVar65 = vpminsd_avx2(ZEXT1632(auVar62),auVar68);
                      auVar66 = vpmaxsd_avx2(auVar66,auVar65);
                      auVar65 = vpmaxsd_avx2(ZEXT1632(auVar60),auVar67);
                      auVar67 = vpmaxsd_avx2(ZEXT1632(auVar63),auVar64);
                      auVar67 = vpminsd_avx2(auVar65,auVar67);
                      auVar65 = vpmaxsd_avx2(ZEXT1632(auVar62),auVar68);
                      auVar67 = vpminsd_avx2(auVar67,auVar65);
                      auVar65 = vpmaxsd_avx2(auVar66,local_27e0);
                      auVar67 = vpminsd_avx2(auVar67,local_27c0);
                      uVar19 = vpcmpd_avx512vl(auVar65,auVar67,2);
                      if ((byte)uVar19 != 0) {
                        auVar65 = vblendmps_avx512vl(auVar156._0_32_,auVar66);
                        bVar58 = (bool)((byte)uVar19 & 1);
                        bVar10 = (bool)((byte)(uVar19 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar19 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar19 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar19 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar19 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar19 >> 6) & 1);
                        bVar16 = SUB81(uVar19 >> 7,0);
                        if (uVar50 != 8) {
                          *puVar52 = uVar50;
                          puVar52 = puVar52 + 1;
                          *pauVar55 = auVar140._0_32_;
                          pauVar55 = pauVar55 + 1;
                        }
                        auVar140 = ZEXT3264(CONCAT428((uint)bVar16 * auVar65._28_4_ |
                                                      (uint)!bVar16 * auVar66._28_4_,
                                                      CONCAT424((uint)bVar15 * auVar65._24_4_ |
                                                                (uint)!bVar15 * auVar66._24_4_,
                                                                CONCAT420((uint)bVar14 *
                                                                          auVar65._20_4_ |
                                                                          (uint)!bVar14 *
                                                                          auVar66._20_4_,
                                                                          CONCAT416((uint)bVar13 *
                                                                                    auVar65._16_4_ |
                                                                                    (uint)!bVar13 *
                                                                                    auVar66._16_4_,
                                                                                    CONCAT412((uint)
                                                  bVar12 * auVar65._12_4_ |
                                                  (uint)!bVar12 * auVar66._12_4_,
                                                  CONCAT48((uint)bVar11 * auVar65._8_4_ |
                                                           (uint)!bVar11 * auVar66._8_4_,
                                                           CONCAT44((uint)bVar10 * auVar65._4_4_ |
                                                                    (uint)!bVar10 * auVar66._4_4_,
                                                                    (uint)bVar58 * auVar65._0_4_ |
                                                                    (uint)!bVar58 * auVar66._0_4_)))
                                                  )))));
                        uVar50 = uVar44;
                      }
                    }
                  } while ((uVar44 != 8) && (bVar58 = uVar56 < 3, uVar56 = uVar56 + 1, bVar58));
                  iVar43 = 0;
                  if (uVar50 == 8) {
LAB_007bca86:
                    bVar58 = false;
                    iVar43 = 4;
                  }
                  else {
                    uVar17 = vcmpps_avx512vl(auVar140._0_32_,local_27c0,9);
                    bVar58 = true;
                    if ((uint)POPCOUNT((int)uVar17) <= (uint)uVar59) {
                      *puVar52 = uVar50;
                      puVar52 = puVar52 + 1;
                      *pauVar55 = auVar140._0_32_;
                      pauVar55 = pauVar55 + 1;
                      goto LAB_007bca86;
                    }
                  }
                  root.ptr = uVar50;
                } while (bVar58);
              }
            }
          }
        } while (iVar43 != 3);
        bVar41 = bVar41 & (byte)local_2d64;
        bVar58 = (bool)(bVar41 >> 1 & 1);
        bVar10 = (bool)(bVar41 >> 2 & 1);
        bVar11 = (bool)(bVar41 >> 3 & 1);
        bVar12 = (bool)(bVar41 >> 4 & 1);
        bVar13 = (bool)(bVar41 >> 5 & 1);
        bVar14 = (bool)(bVar41 >> 6 & 1);
        *(uint *)local_2d78 =
             (uint)(bVar41 & 1) * -0x800000 | (uint)!(bool)(bVar41 & 1) * *(int *)local_2d78;
        *(uint *)(local_2d78 + 4) =
             (uint)bVar58 * -0x800000 | (uint)!bVar58 * *(int *)(local_2d78 + 4);
        *(uint *)(local_2d78 + 8) =
             (uint)bVar10 * -0x800000 | (uint)!bVar10 * *(int *)(local_2d78 + 8);
        *(uint *)(local_2d78 + 0xc) =
             (uint)bVar11 * -0x800000 | (uint)!bVar11 * *(int *)(local_2d78 + 0xc);
        *(uint *)(local_2d78 + 0x10) =
             (uint)bVar12 * -0x800000 | (uint)!bVar12 * *(int *)(local_2d78 + 0x10);
        *(uint *)(local_2d78 + 0x14) =
             (uint)bVar13 * -0x800000 | (uint)!bVar13 * *(int *)(local_2d78 + 0x14);
        *(uint *)(local_2d78 + 0x18) =
             (uint)bVar14 * -0x800000 | (uint)!bVar14 * *(int *)(local_2d78 + 0x18);
        *(uint *)(local_2d78 + 0x1c) =
             (uint)(bVar41 >> 7) * -0x800000 |
             (uint)!(bool)(bVar41 >> 7) * *(int *)(local_2d78 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }